

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 (*pauVar8) [16];
  Primitive *pPVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Primitive PVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  Geometry *pGVar31;
  __int_type_conflict _Var32;
  long lVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined3 uVar46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined6 uVar81;
  undefined1 auVar82 [12];
  unkbyte9 Var83;
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [13];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [13];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  bool bVar117;
  bool bVar118;
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [13];
  undefined1 auVar136 [13];
  undefined1 auVar137 [13];
  undefined1 auVar138 [13];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  bool bVar143;
  byte bVar144;
  uint uVar145;
  ulong uVar146;
  ulong uVar147;
  RTCFilterFunctionN p_Var148;
  RTCRayN *pRVar149;
  byte bVar150;
  long lVar151;
  long lVar152;
  uint uVar153;
  uint uVar154;
  uint uVar155;
  uint uVar156;
  uint uVar157;
  short sVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar162 [12];
  float fVar222;
  vfloat_impl<4> p00;
  undefined1 auVar163 [12];
  char cVar228;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar164 [12];
  undefined1 auVar175 [16];
  undefined1 auVar165 [12];
  undefined1 auVar179 [16];
  float fVar227;
  float fVar229;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar166 [12];
  undefined1 auVar188 [16];
  undefined1 auVar167 [12];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar230;
  float fVar261;
  float fVar262;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  int iVar263;
  char cVar294;
  undefined1 uVar295;
  int iVar296;
  float fVar298;
  vfloat4 a_1;
  int iVar264;
  int iVar265;
  undefined1 auVar269 [16];
  char cVar297;
  undefined1 auVar273 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar299;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar304;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar305;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar306;
  float fVar307;
  undefined1 auVar308 [12];
  float fVar325;
  float fVar326;
  float fVar328;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar314 [16];
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  char cVar347;
  float fVar335;
  float fVar336;
  float fVar348;
  float fVar350;
  undefined1 auVar337 [16];
  float fVar349;
  float fVar351;
  float fVar352;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar354 [16];
  float fVar359;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar372 [12];
  float fVar387;
  undefined1 auVar373 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  float fVar388;
  float fVar398;
  float fVar400;
  vfloat4 a;
  float fVar389;
  undefined1 auVar390 [16];
  float fVar399;
  float fVar401;
  float fVar402;
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  float fVar403;
  float fVar404;
  float fVar411;
  float fVar414;
  vfloat4 a_2;
  undefined1 auVar405 [16];
  float fVar412;
  float fVar413;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar430;
  float fVar433;
  vfloat4 a_3;
  undefined1 auVar424 [16];
  float fVar431;
  undefined1 auVar425 [16];
  float fVar432;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  float fVar438;
  float fVar442;
  float fVar450;
  float fVar453;
  float fVar457;
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar451;
  float fVar454;
  float fVar455;
  float fVar458;
  undefined1 auVar446 [16];
  float fVar452;
  float fVar456;
  float fVar459;
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float fVar465;
  float fVar466;
  float fVar470;
  float fVar471;
  float fVar477;
  float fVar478;
  float fVar483;
  undefined1 auVar467 [16];
  float fVar472;
  float fVar473;
  float fVar474;
  float fVar475;
  float fVar476;
  float fVar479;
  float fVar480;
  float fVar481;
  float fVar482;
  float fVar484;
  float fVar485;
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  float fVar486;
  float fVar487;
  float fVar488;
  float fVar489;
  float fVar494;
  float fVar495;
  undefined1 auVar490 [16];
  float fVar496;
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  float fVar497;
  float fVar499;
  float fVar500;
  float fVar501;
  float fVar502;
  undefined1 auVar498 [16];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  BBox1f local_538;
  undefined1 local_528 [6];
  undefined2 uStack_522;
  float fStack_520;
  float fStack_51c;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  undefined1 local_3a8 [16];
  undefined1 (*local_398) [16];
  Primitive *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar161 [12];
  undefined1 auVar185 [16];
  undefined1 auVar189 [16];
  undefined1 auVar193 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar187 [16];
  undefined1 auVar191 [16];
  undefined1 auVar195 [16];
  undefined2 uVar221;
  int iVar223;
  int iVar224;
  int iVar225;
  int iVar226;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar266 [12];
  undefined1 auVar267 [12];
  undefined1 auVar268 [12];
  undefined1 auVar274 [16];
  undefined1 auVar278 [16];
  undefined1 auVar282 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar283 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar386;
  
  PVar25 = prim[1];
  uVar146 = (ulong)(byte)PVar25;
  lVar151 = uVar146 * 0x25;
  uVar10 = *(undefined4 *)(prim + uVar146 * 4 + 6);
  uVar26 = *(undefined4 *)(prim + uVar146 * 5 + 6);
  uVar27 = *(undefined4 *)(prim + uVar146 * 6 + 6);
  uVar11 = *(undefined4 *)(prim + uVar146 * 0xf + 6);
  uVar28 = *(undefined4 *)(prim + (ulong)(byte)PVar25 * 0x10 + 6);
  uVar29 = *(undefined4 *)(prim + uVar146 * 0x11 + 6);
  uVar12 = *(undefined4 *)(prim + uVar146 * 0x1a + 6);
  uVar13 = *(undefined4 *)(prim + uVar146 * 0x1b + 6);
  uVar30 = *(undefined4 *)(prim + uVar146 * 0x1c + 6);
  pPVar9 = prim + lVar151 + 6;
  fVar477 = *(float *)(pPVar9 + 0xc);
  fVar230 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar477;
  fVar261 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar477;
  fVar262 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar477;
  fVar460 = *(float *)(ray + k * 4 + 0x40) * fVar477;
  fVar470 = *(float *)(ray + k * 4 + 0x50) * fVar477;
  fVar477 = *(float *)(ray + k * 4 + 0x60) * fVar477;
  uVar295 = (undefined1)((uint)uVar26 >> 0x18);
  uVar221 = CONCAT11(uVar295,uVar295);
  uVar295 = (undefined1)((uint)uVar26 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar221,uVar295),CONCAT14(uVar295,uVar26));
  cVar294 = (char)((uint)uVar26 >> 8);
  uVar81 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),cVar294),cVar294);
  cVar228 = (char)uVar26;
  uVar147 = CONCAT62(uVar81,CONCAT11(cVar228,cVar228));
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar147;
  auVar271._12_2_ = uVar221;
  auVar271._14_2_ = uVar221;
  uVar221 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar147;
  auVar270._10_2_ = uVar221;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar221;
  auVar269._0_8_ = uVar147;
  uVar221 = (undefined2)uVar81;
  auVar82._4_8_ = auVar269._8_8_;
  auVar82._2_2_ = uVar221;
  auVar82._0_2_ = uVar221;
  iVar263 = (int)CONCAT11(cVar228,cVar228) >> 8;
  iVar296 = auVar82._0_4_ >> 0x18;
  auVar266._0_8_ = CONCAT44(iVar296,iVar263);
  auVar266._8_4_ = auVar269._8_4_ >> 0x18;
  auVar272._12_4_ = auVar270._12_4_ >> 0x18;
  auVar272._0_12_ = auVar266;
  fVar430 = (float)iVar296;
  cVar297 = cVar294 >> 7;
  auVar49[0xd] = 0;
  auVar49._0_13_ = auVar272._0_13_;
  auVar49[0xe] = cVar297;
  auVar53[0xc] = cVar297;
  auVar53._0_12_ = auVar266;
  auVar53._13_2_ = auVar49._13_2_;
  auVar57[0xb] = 0;
  auVar57._0_11_ = auVar266._0_11_;
  auVar57._12_3_ = auVar53._12_3_;
  auVar61[10] = cVar297;
  auVar61._0_10_ = auVar266._0_10_;
  auVar61._11_4_ = auVar57._11_4_;
  auVar65[9] = 0;
  auVar65._0_9_ = auVar266._0_9_;
  auVar65._10_5_ = auVar61._10_5_;
  auVar69[8] = cVar294;
  auVar69._0_8_ = auVar266._0_8_;
  auVar69._9_6_ = auVar65._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar69._8_7_,(char)((uint)uVar27 >> 0x18)),(short)cVar228 >> 7);
  auVar73._6_9_ = Var83;
  auVar73[5] = (char)((uint)uVar27 >> 0x10);
  auVar73[4] = (undefined1)((short)cVar228 >> 7);
  auVar73._0_4_ = iVar263;
  cVar297 = (char)((uint)uVar27 >> 8);
  auVar84._2_11_ = auVar73._4_11_;
  auVar84[1] = cVar297;
  auVar84[0] = (undefined1)((short)cVar228 >> 7);
  cVar294 = (char)uVar27;
  auVar77._2_13_ = auVar84;
  auVar77._0_2_ = CONCAT11(cVar294,cVar228);
  uVar221 = (undefined2)Var83;
  auVar275._0_12_ = auVar77._0_12_;
  auVar275._12_2_ = uVar221;
  auVar275._14_2_ = uVar221;
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._0_10_ = auVar77._0_10_;
  auVar274._10_2_ = auVar73._4_2_;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._0_8_ = auVar77._0_8_;
  auVar273._8_2_ = auVar73._4_2_;
  auVar85._4_8_ = auVar273._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  iVar264 = (int)CONCAT11(cVar294,cVar228) >> 8;
  iVar296 = auVar85._0_4_ >> 0x18;
  auVar267._0_8_ = CONCAT44(iVar296,iVar264);
  auVar267._8_4_ = auVar273._8_4_ >> 0x18;
  auVar276._12_4_ = auVar274._12_4_ >> 0x18;
  auVar276._0_12_ = auVar267;
  fVar499 = (float)iVar296;
  cVar228 = cVar297 >> 7;
  auVar50[0xd] = 0;
  auVar50._0_13_ = auVar276._0_13_;
  auVar50[0xe] = cVar228;
  auVar54[0xc] = cVar228;
  auVar54._0_12_ = auVar267;
  auVar54._13_2_ = auVar50._13_2_;
  auVar58[0xb] = 0;
  auVar58._0_11_ = auVar267._0_11_;
  auVar58._12_3_ = auVar54._12_3_;
  auVar62[10] = cVar228;
  auVar62._0_10_ = auVar267._0_10_;
  auVar62._11_4_ = auVar58._11_4_;
  auVar66[9] = 0;
  auVar66._0_9_ = auVar267._0_9_;
  auVar66._10_5_ = auVar62._10_5_;
  auVar70[8] = cVar297;
  auVar70._0_8_ = auVar267._0_8_;
  auVar70._9_6_ = auVar66._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar70._8_7_,(char)((uint)uVar28 >> 0x18)),(short)cVar294 >> 7);
  auVar74._6_9_ = Var83;
  auVar74[5] = (char)((uint)uVar28 >> 0x10);
  auVar74[4] = (undefined1)((short)cVar294 >> 7);
  auVar74._0_4_ = iVar264;
  cVar347 = (char)((uint)uVar28 >> 8);
  auVar86._2_11_ = auVar74._4_11_;
  auVar86[1] = cVar347;
  auVar86[0] = (undefined1)((short)cVar294 >> 7);
  cVar297 = (char)uVar28;
  auVar78._2_13_ = auVar86;
  auVar78._0_2_ = CONCAT11(cVar297,cVar294);
  uVar221 = (undefined2)Var83;
  auVar279._0_12_ = auVar78._0_12_;
  auVar279._12_2_ = uVar221;
  auVar279._14_2_ = uVar221;
  auVar278._12_4_ = auVar279._12_4_;
  auVar278._0_10_ = auVar78._0_10_;
  auVar278._10_2_ = auVar74._4_2_;
  auVar277._10_6_ = auVar278._10_6_;
  auVar277._0_8_ = auVar78._0_8_;
  auVar277._8_2_ = auVar74._4_2_;
  auVar87._4_8_ = auVar277._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  iVar265 = (int)CONCAT11(cVar297,cVar294) >> 8;
  iVar296 = auVar87._0_4_ >> 0x18;
  auVar268._0_8_ = CONCAT44(iVar296,iVar265);
  auVar268._8_4_ = auVar277._8_4_ >> 0x18;
  auVar280._12_4_ = auVar278._12_4_ >> 0x18;
  auVar280._0_12_ = auVar268;
  fVar411 = (float)iVar296;
  cVar228 = cVar347 >> 7;
  auVar51[0xd] = 0;
  auVar51._0_13_ = auVar280._0_13_;
  auVar51[0xe] = cVar228;
  auVar55[0xc] = cVar228;
  auVar55._0_12_ = auVar268;
  auVar55._13_2_ = auVar51._13_2_;
  auVar59[0xb] = 0;
  auVar59._0_11_ = auVar268._0_11_;
  auVar59._12_3_ = auVar55._12_3_;
  auVar63[10] = cVar228;
  auVar63._0_10_ = auVar268._0_10_;
  auVar63._11_4_ = auVar59._11_4_;
  auVar67[9] = 0;
  auVar67._0_9_ = auVar268._0_9_;
  auVar67._10_5_ = auVar63._10_5_;
  auVar71[8] = cVar347;
  auVar71._0_8_ = auVar268._0_8_;
  auVar71._9_6_ = auVar67._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar71._8_7_,(char)((uint)uVar29 >> 0x18)),(short)cVar297 >> 7);
  auVar75._6_9_ = Var83;
  auVar75[5] = (char)((uint)uVar29 >> 0x10);
  auVar75[4] = (undefined1)((short)cVar297 >> 7);
  auVar75._0_4_ = iVar265;
  auVar88._2_11_ = auVar75._4_11_;
  auVar88[1] = (char)((uint)uVar29 >> 8);
  auVar88[0] = (undefined1)((short)cVar297 >> 7);
  sVar158 = CONCAT11((char)uVar29,cVar297);
  auVar79._2_13_ = auVar88;
  auVar79._0_2_ = sVar158;
  uVar221 = (undefined2)Var83;
  auVar283._0_12_ = auVar79._0_12_;
  auVar283._12_2_ = uVar221;
  auVar283._14_2_ = uVar221;
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._0_10_ = auVar79._0_10_;
  auVar282._10_2_ = auVar75._4_2_;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._0_8_ = auVar79._0_8_;
  auVar281._8_2_ = auVar75._4_2_;
  auVar89._4_8_ = auVar281._8_8_;
  auVar89._2_2_ = auVar88._0_2_;
  auVar89._0_2_ = auVar88._0_2_;
  fVar306 = (float)((int)sVar158 >> 8);
  fVar325 = (float)(auVar89._0_4_ >> 0x18);
  fVar328 = (float)(auVar281._8_4_ >> 0x18);
  fVar159 = fVar477 * fVar306;
  fVar222 = fVar477 * fVar325;
  auVar161._0_8_ = CONCAT44(fVar222,fVar159);
  auVar161._8_4_ = fVar477 * fVar328;
  auVar231._12_4_ = fVar477 * (float)(auVar282._12_4_ >> 0x18);
  auVar231._0_12_ = auVar161;
  fVar486 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar151 + 0x16)) *
            *(float *)(prim + lVar151 + 0x1a);
  local_548[0] = (char)uVar10;
  local_548[1] = (char)((uint)uVar10 >> 8);
  local_548[2] = (undefined1)((uint)uVar10 >> 0x10);
  local_548[3] = (undefined1)((uint)uVar10 >> 0x18);
  auVar103[0xd] = 0;
  auVar103._0_13_ = auVar231._0_13_;
  auVar103[0xe] = (char)((uint)fVar222 >> 0x18);
  auVar109[0xc] = (char)((uint)fVar222 >> 0x10);
  auVar109._0_12_ = auVar161;
  auVar109._13_2_ = auVar103._13_2_;
  auVar113[0xb] = 0;
  auVar113._0_11_ = auVar161._0_11_;
  auVar113._12_3_ = auVar109._12_3_;
  auVar119[10] = (char)((uint)fVar222 >> 8);
  auVar119._0_10_ = auVar161._0_10_;
  auVar119._11_4_ = auVar113._11_4_;
  auVar123[9] = 0;
  auVar123._0_9_ = auVar161._0_9_;
  auVar123._10_5_ = auVar119._10_5_;
  auVar127[8] = SUB41(fVar222,0);
  auVar127._0_8_ = auVar161._0_8_;
  auVar127._9_6_ = auVar123._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar127._8_7_,local_548[3]),(char)((uint)fVar159 >> 0x18));
  auVar131._6_9_ = Var83;
  auVar131[5] = local_548[2];
  auVar131[4] = (char)((uint)fVar159 >> 0x10);
  auVar131._0_4_ = fVar159;
  auVar135._2_11_ = auVar131._4_11_;
  auVar135[1] = local_548[1];
  auVar135[0] = (char)((uint)fVar159 >> 8);
  sVar158 = CONCAT11(local_548[0],SUB41(fVar159,0));
  auVar139._2_13_ = auVar135;
  auVar139._0_2_ = sVar158;
  uVar221 = (undefined2)Var83;
  auVar301._0_12_ = auVar139._0_12_;
  auVar301._12_2_ = uVar221;
  auVar301._14_2_ = uVar221;
  auVar446._12_4_ = auVar301._12_4_;
  auVar446._0_10_ = auVar139._0_10_;
  auVar446._10_2_ = auVar131._4_2_;
  auVar246._10_6_ = auVar446._10_6_;
  auVar246._0_8_ = auVar139._0_8_;
  auVar246._8_2_ = auVar131._4_2_;
  auVar90._4_8_ = auVar246._8_8_;
  auVar90._2_2_ = auVar135._0_2_;
  auVar90._0_2_ = auVar135._0_2_;
  iVar296 = (int)sVar158 >> 8;
  iVar223 = auVar90._0_4_ >> 0x18;
  auVar162._0_8_ = CONCAT44(iVar223,iVar296);
  auVar162._8_4_ = auVar246._8_4_ >> 0x18;
  auVar287._12_4_ = auVar446._12_4_ >> 0x18;
  auVar287._0_12_ = auVar162;
  fVar367 = (float)iVar223;
  local_538.lower._0_1_ = (char)uVar11;
  local_538.lower._1_1_ = (char)((uint)uVar11 >> 8);
  local_538.lower._2_1_ = (undefined1)((uint)uVar11 >> 0x10);
  local_538.lower._3_1_ = (undefined1)((uint)uVar11 >> 0x18);
  cVar228 = local_548[1] >> 7;
  auVar104[0xd] = 0;
  auVar104._0_13_ = auVar287._0_13_;
  auVar104[0xe] = cVar228;
  auVar110[0xc] = cVar228;
  auVar110._0_12_ = auVar162;
  auVar110._13_2_ = auVar104._13_2_;
  auVar114[0xb] = 0;
  auVar114._0_11_ = auVar162._0_11_;
  auVar114._12_3_ = auVar110._12_3_;
  auVar120[10] = cVar228;
  auVar120._0_10_ = auVar162._0_10_;
  auVar120._11_4_ = auVar114._11_4_;
  auVar124[9] = 0;
  auVar124._0_9_ = auVar162._0_9_;
  auVar124._10_5_ = auVar120._10_5_;
  auVar128[8] = local_548[1];
  auVar128._0_8_ = auVar162._0_8_;
  auVar128._9_6_ = auVar124._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar128._8_7_,local_538.lower._3_1_),(short)local_548[0] >> 7);
  auVar132._6_9_ = Var83;
  auVar132[5] = local_538.lower._2_1_;
  auVar132[4] = (undefined1)((short)local_548[0] >> 7);
  auVar132._0_4_ = iVar296;
  auVar136._2_11_ = auVar132._4_11_;
  auVar136[1] = local_538.lower._1_1_;
  auVar136[0] = (undefined1)((short)local_548[0] >> 7);
  auVar140._2_13_ = auVar136;
  auVar140._0_2_ = CONCAT11(local_538.lower._0_1_,local_548[0]);
  uVar221 = (undefined2)Var83;
  auVar169._0_12_ = auVar140._0_12_;
  auVar169._12_2_ = uVar221;
  auVar169._14_2_ = uVar221;
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._0_10_ = auVar140._0_10_;
  auVar168._10_2_ = auVar132._4_2_;
  auVar392._10_6_ = auVar168._10_6_;
  auVar392._0_8_ = auVar140._0_8_;
  auVar392._8_2_ = auVar132._4_2_;
  auVar91._4_8_ = auVar392._8_8_;
  auVar91._2_2_ = auVar136._0_2_;
  auVar91._0_2_ = auVar136._0_2_;
  iVar223 = (int)CONCAT11(local_538.lower._0_1_,local_548[0]) >> 8;
  iVar224 = auVar91._0_4_ >> 0x18;
  auVar163._0_8_ = CONCAT44(iVar224,iVar223);
  auVar163._8_4_ = auVar392._8_4_ >> 0x18;
  auVar170._12_4_ = auVar168._12_4_ >> 0x18;
  auVar170._0_12_ = auVar163;
  fVar355 = (float)iVar224;
  local_528[0] = (char)uVar12;
  local_528[1] = (char)((uint)uVar12 >> 8);
  local_528[2] = (undefined1)((uint)uVar12 >> 0x10);
  local_528[3] = (undefined1)((uint)uVar12 >> 0x18);
  cVar228 = local_538.lower._1_1_ >> 7;
  auVar105[0xd] = 0;
  auVar105._0_13_ = auVar170._0_13_;
  auVar105[0xe] = cVar228;
  auVar111[0xc] = cVar228;
  auVar111._0_12_ = auVar163;
  auVar111._13_2_ = auVar105._13_2_;
  auVar115[0xb] = 0;
  auVar115._0_11_ = auVar163._0_11_;
  auVar115._12_3_ = auVar111._12_3_;
  auVar121[10] = cVar228;
  auVar121._0_10_ = auVar163._0_10_;
  auVar121._11_4_ = auVar115._11_4_;
  auVar125[9] = 0;
  auVar125._0_9_ = auVar163._0_9_;
  auVar125._10_5_ = auVar121._10_5_;
  auVar129[8] = local_538.lower._1_1_;
  auVar129._0_8_ = auVar163._0_8_;
  auVar129._9_6_ = auVar125._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar129._8_7_,local_528[3]),(short)local_538.lower._0_1_ >> 7);
  auVar133._6_9_ = Var83;
  auVar133[5] = local_528[2];
  auVar133[4] = (undefined1)((short)local_538.lower._0_1_ >> 7);
  auVar133._0_4_ = iVar223;
  auVar137._2_11_ = auVar133._4_11_;
  auVar137[1] = local_528[1];
  auVar137[0] = (undefined1)((short)local_538.lower._0_1_ >> 7);
  auVar141._2_13_ = auVar137;
  auVar141._0_2_ = CONCAT11(local_528[0],local_538.lower._0_1_);
  uVar221 = (undefined2)Var83;
  auVar173._0_12_ = auVar141._0_12_;
  auVar173._12_2_ = uVar221;
  auVar173._14_2_ = uVar221;
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._0_10_ = auVar141._0_10_;
  auVar172._10_2_ = auVar133._4_2_;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._0_8_ = auVar141._0_8_;
  auVar171._8_2_ = auVar133._4_2_;
  auVar92._4_8_ = auVar171._8_8_;
  auVar92._2_2_ = auVar137._0_2_;
  auVar92._0_2_ = auVar137._0_2_;
  iVar224 = (int)CONCAT11(local_528[0],local_538.lower._0_1_) >> 8;
  iVar225 = auVar92._0_4_ >> 0x18;
  auVar164._0_8_ = CONCAT44(iVar225,iVar224);
  auVar164._8_4_ = auVar171._8_4_ >> 0x18;
  auVar174._12_4_ = auVar172._12_4_ >> 0x18;
  auVar174._0_12_ = auVar164;
  fVar326 = (float)iVar225;
  p00_1.field_0.i[0]._0_1_ = (undefined1)uVar13;
  p00_1.field_0.i[0]._1_1_ = (undefined1)((uint)uVar13 >> 8);
  p00_1.field_0.i[0]._2_1_ = (undefined1)((uint)uVar13 >> 0x10);
  p00_1.field_0.i[0]._3_1_ = (undefined1)((uint)uVar13 >> 0x18);
  cVar228 = local_528[1] >> 7;
  auVar106[0xd] = 0;
  auVar106._0_13_ = auVar174._0_13_;
  auVar106[0xe] = cVar228;
  auVar112[0xc] = cVar228;
  auVar112._0_12_ = auVar164;
  auVar112._13_2_ = auVar106._13_2_;
  auVar116[0xb] = 0;
  auVar116._0_11_ = auVar164._0_11_;
  auVar116._12_3_ = auVar112._12_3_;
  auVar122[10] = cVar228;
  auVar122._0_10_ = auVar164._0_10_;
  auVar122._11_4_ = auVar116._11_4_;
  auVar126[9] = 0;
  auVar126._0_9_ = auVar164._0_9_;
  auVar126._10_5_ = auVar122._10_5_;
  auVar130[8] = local_528[1];
  auVar130._0_8_ = auVar164._0_8_;
  auVar130._9_6_ = auVar126._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar130._8_7_,p00_1.field_0.i[0]._3_1_),(short)local_528[0] >> 7);
  auVar134._6_9_ = Var83;
  auVar134[5] = p00_1.field_0.i[0]._2_1_;
  auVar134[4] = (undefined1)((short)local_528[0] >> 7);
  auVar134._0_4_ = iVar224;
  auVar138._2_11_ = auVar134._4_11_;
  auVar138[1] = p00_1.field_0.i[0]._1_1_;
  auVar138[0] = (undefined1)((short)local_528[0] >> 7);
  auVar142._2_13_ = auVar138;
  auVar142._0_2_ = CONCAT11(p00_1.field_0.i[0]._0_1_,local_528[0]);
  uVar221 = (undefined2)Var83;
  auVar177._0_12_ = auVar142._0_12_;
  auVar177._12_2_ = uVar221;
  auVar177._14_2_ = uVar221;
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._0_10_ = auVar142._0_10_;
  auVar176._10_2_ = auVar134._4_2_;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._0_8_ = auVar142._0_8_;
  auVar175._8_2_ = auVar134._4_2_;
  auVar93._4_8_ = auVar175._8_8_;
  auVar93._2_2_ = auVar138._0_2_;
  auVar93._0_2_ = auVar138._0_2_;
  iVar225 = (int)CONCAT11(p00_1.field_0.i[0]._0_1_,local_528[0]) >> 8;
  iVar226 = auVar93._0_4_ >> 0x18;
  auVar165._0_8_ = CONCAT44(iVar226,iVar225);
  auVar165._8_4_ = auVar175._8_4_ >> 0x18;
  auVar178._12_4_ = auVar176._12_4_ >> 0x18;
  auVar178._0_12_ = auVar165;
  fVar304 = (float)iVar226;
  cVar228 = (char)p00_1.field_0.i[0]._1_1_ >> 7;
  auVar52[0xd] = 0;
  auVar52._0_13_ = auVar178._0_13_;
  auVar52[0xe] = cVar228;
  auVar56[0xc] = cVar228;
  auVar56._0_12_ = auVar165;
  auVar56._13_2_ = auVar52._13_2_;
  auVar60[0xb] = 0;
  auVar60._0_11_ = auVar165._0_11_;
  auVar60._12_3_ = auVar56._12_3_;
  auVar64[10] = cVar228;
  auVar64._0_10_ = auVar165._0_10_;
  auVar64._11_4_ = auVar60._11_4_;
  auVar68[9] = 0;
  auVar68._0_9_ = auVar165._0_9_;
  auVar68._10_5_ = auVar64._10_5_;
  auVar72[8] = p00_1.field_0.i[0]._1_1_;
  auVar72._0_8_ = auVar165._0_8_;
  auVar72._9_6_ = auVar68._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar72._8_7_,(char)((uint)uVar30 >> 0x18)),
                   (short)(char)p00_1.field_0.i[0]._0_1_ >> 7);
  auVar76._6_9_ = Var83;
  auVar76[5] = (char)((uint)uVar30 >> 0x10);
  auVar76[4] = (undefined1)((short)(char)p00_1.field_0.i[0]._0_1_ >> 7);
  auVar76._0_4_ = iVar225;
  auVar94._2_11_ = auVar76._4_11_;
  auVar94[1] = (char)((uint)uVar30 >> 8);
  auVar94[0] = (undefined1)((short)(char)p00_1.field_0.i[0]._0_1_ >> 7);
  sVar158 = CONCAT11((char)uVar30,p00_1.field_0.i[0]._0_1_);
  auVar80._2_13_ = auVar94;
  auVar80._0_2_ = sVar158;
  uVar221 = (undefined2)Var83;
  auVar181._0_12_ = auVar80._0_12_;
  auVar181._12_2_ = uVar221;
  auVar181._14_2_ = uVar221;
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._0_10_ = auVar80._0_10_;
  auVar180._10_2_ = auVar76._4_2_;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._0_8_ = auVar80._0_8_;
  auVar179._8_2_ = auVar76._4_2_;
  auVar95._4_8_ = auVar179._8_8_;
  auVar95._2_2_ = auVar94._0_2_;
  auVar95._0_2_ = auVar94._0_2_;
  fVar160 = (float)((int)sVar158 >> 8);
  fVar227 = (float)(auVar95._0_4_ >> 0x18);
  fVar229 = (float)(auVar179._8_4_ >> 0x18);
  fVar461 = fVar460 * (float)iVar296 + fVar470 * (float)iVar263 + fVar477 * (float)iVar264;
  fVar471 = fVar460 * fVar367 + fVar470 * fVar430 + fVar477 * fVar499;
  fVar478 = fVar460 * (float)auVar162._8_4_ +
            fVar470 * (float)auVar266._8_4_ + fVar477 * (float)auVar267._8_4_;
  fVar483 = fVar460 * (float)auVar287._12_4_ +
            fVar470 * (float)auVar272._12_4_ + fVar477 * (float)auVar276._12_4_;
  fVar438 = fVar460 * (float)iVar223 + fVar470 * (float)iVar265 + fVar159;
  fVar450 = fVar460 * fVar355 + fVar470 * fVar411 + fVar222;
  fVar453 = fVar460 * (float)auVar163._8_4_ + fVar470 * (float)auVar268._8_4_ + auVar161._8_4_;
  fVar457 = fVar460 * (float)auVar170._12_4_ + fVar470 * (float)auVar280._12_4_ + auVar231._12_4_;
  fVar335 = fVar460 * (float)iVar224 + fVar470 * (float)iVar225 + fVar477 * fVar160;
  fVar348 = fVar460 * fVar326 + fVar470 * fVar304 + fVar477 * fVar227;
  fVar350 = fVar460 * (float)auVar164._8_4_ + fVar470 * (float)auVar165._8_4_ + fVar477 * fVar229;
  fVar460 = fVar460 * (float)auVar174._12_4_ +
            fVar470 * (float)auVar178._12_4_ + fVar477 * (float)(auVar180._12_4_ >> 0x18);
  uVar14 = *(undefined8 *)(prim + uVar146 * 7 + 6);
  uVar15 = *(undefined8 *)(prim + uVar146 * 0xb + 6);
  uVar16 = *(undefined8 *)(prim + uVar146 * 9 + 6);
  uVar17 = *(undefined8 *)(prim + uVar146 * 0xd + 6);
  uVar18 = *(undefined8 *)(prim + uVar146 * 0x12 + 6);
  fVar359 = (float)iVar296 * fVar230 + (float)iVar263 * fVar261 + (float)iVar264 * fVar262;
  fVar499 = fVar367 * fVar230 + fVar430 * fVar261 + fVar499 * fVar262;
  fVar369 = (float)auVar162._8_4_ * fVar230 +
            (float)auVar266._8_4_ * fVar261 + (float)auVar267._8_4_ * fVar262;
  fVar371 = (float)auVar287._12_4_ * fVar230 +
            (float)auVar272._12_4_ * fVar261 + (float)auVar276._12_4_ * fVar262;
  auVar373._0_4_ = (float)iVar223 * fVar230 + (float)iVar265 * fVar261 + fVar306 * fVar262;
  fVar386 = fVar355 * fVar230 + fVar411 * fVar261 + fVar325 * fVar262;
  auVar372._0_8_ = CONCAT44(fVar386,auVar373._0_4_);
  auVar372._8_4_ =
       (float)auVar163._8_4_ * fVar230 + (float)auVar268._8_4_ * fVar261 + fVar328 * fVar262;
  fVar387 = (float)auVar170._12_4_ * fVar230 +
            (float)auVar280._12_4_ * fVar261 + (float)(auVar282._12_4_ >> 0x18) * fVar262;
  fVar367 = fVar230 * (float)iVar224 + fVar261 * (float)iVar225 + fVar262 * fVar160;
  fVar411 = fVar230 * fVar326 + fVar261 * fVar304 + fVar262 * fVar227;
  fVar430 = fVar230 * (float)auVar164._8_4_ + fVar261 * (float)auVar165._8_4_ + fVar262 * fVar229;
  fVar470 = fVar230 * (float)auVar174._12_4_ +
            fVar261 * (float)auVar178._12_4_ + fVar262 * (float)(auVar180._12_4_ >> 0x18);
  fVar477 = (float)DAT_01f4bd50;
  fVar159 = DAT_01f4bd50._4_4_;
  fVar160 = DAT_01f4bd50._8_4_;
  fVar222 = DAT_01f4bd50._12_4_;
  uVar154 = -(uint)(fVar477 <= ABS(fVar461));
  uVar155 = -(uint)(fVar159 <= ABS(fVar471));
  uVar156 = -(uint)(fVar160 <= ABS(fVar478));
  uVar157 = -(uint)(fVar222 <= ABS(fVar483));
  auVar467._0_4_ = (uint)fVar461 & uVar154;
  auVar467._4_4_ = (uint)fVar471 & uVar155;
  auVar467._8_4_ = (uint)fVar478 & uVar156;
  auVar467._12_4_ = (uint)fVar483 & uVar157;
  auVar182._0_4_ = ~uVar154 & (uint)fVar477;
  auVar182._4_4_ = ~uVar155 & (uint)fVar159;
  auVar182._8_4_ = ~uVar156 & (uint)fVar160;
  auVar182._12_4_ = ~uVar157 & (uint)fVar222;
  auVar182 = auVar182 | auVar467;
  uVar154 = -(uint)(fVar477 <= ABS(fVar438));
  uVar155 = -(uint)(fVar159 <= ABS(fVar450));
  uVar156 = -(uint)(fVar160 <= ABS(fVar453));
  uVar157 = -(uint)(fVar222 <= ABS(fVar457));
  auVar443._0_4_ = (uint)fVar438 & uVar154;
  auVar443._4_4_ = (uint)fVar450 & uVar155;
  auVar443._8_4_ = (uint)fVar453 & uVar156;
  auVar443._12_4_ = (uint)fVar457 & uVar157;
  auVar309._0_4_ = ~uVar154 & (uint)fVar477;
  auVar309._4_4_ = ~uVar155 & (uint)fVar159;
  auVar309._8_4_ = ~uVar156 & (uint)fVar160;
  auVar309._12_4_ = ~uVar157 & (uint)fVar222;
  auVar309 = auVar309 | auVar443;
  uVar154 = -(uint)(fVar477 <= ABS(fVar335));
  uVar155 = -(uint)(fVar159 <= ABS(fVar348));
  uVar156 = -(uint)(fVar160 <= ABS(fVar350));
  uVar157 = -(uint)(fVar222 <= ABS(fVar460));
  auVar337._0_4_ = (uint)fVar335 & uVar154;
  auVar337._4_4_ = (uint)fVar348 & uVar155;
  auVar337._8_4_ = (uint)fVar350 & uVar156;
  auVar337._12_4_ = (uint)fVar460 & uVar157;
  auVar444._0_4_ = ~uVar154 & (uint)fVar477;
  auVar444._4_4_ = ~uVar155 & (uint)fVar159;
  auVar444._8_4_ = ~uVar156 & (uint)fVar160;
  auVar444._12_4_ = ~uVar157 & (uint)fVar222;
  auVar444 = auVar444 | auVar337;
  auVar231 = rcpps(_DAT_01f4bd50,auVar182);
  fVar348 = auVar231._0_4_;
  auVar183._0_4_ = auVar182._0_4_ * fVar348;
  fVar350 = auVar231._4_4_;
  auVar183._4_4_ = auVar182._4_4_ * fVar350;
  fVar460 = auVar231._8_4_;
  auVar183._8_4_ = auVar182._8_4_ * fVar460;
  fVar355 = auVar231._12_4_;
  auVar183._12_4_ = auVar182._12_4_ * fVar355;
  fVar348 = (1.0 - auVar183._0_4_) * fVar348 + fVar348;
  fVar350 = (1.0 - auVar183._4_4_) * fVar350 + fVar350;
  fVar460 = (1.0 - auVar183._8_4_) * fVar460 + fVar460;
  fVar355 = (1.0 - auVar183._12_4_) * fVar355 + fVar355;
  auVar231 = rcpps(auVar183,auVar309);
  fVar477 = auVar231._0_4_;
  auVar310._0_4_ = auVar309._0_4_ * fVar477;
  fVar159 = auVar231._4_4_;
  fVar227 = auVar309._4_4_ * fVar159;
  auVar308._0_8_ = CONCAT44(fVar227,auVar310._0_4_);
  fVar262 = auVar231._8_4_;
  auVar308._8_4_ = auVar309._8_4_ * fVar262;
  fVar328 = auVar231._12_4_;
  fVar477 = (1.0 - auVar310._0_4_) * fVar477 + fVar477;
  fVar159 = (1.0 - fVar227) * fVar159 + fVar159;
  fVar262 = (1.0 - auVar308._8_4_) * fVar262 + fVar262;
  fVar328 = (1.0 - auVar309._12_4_ * fVar328) * fVar328 + fVar328;
  auVar231 = rcpps(auVar231,auVar444);
  auVar184._0_4_ = auVar231._0_4_;
  fVar160 = auVar231._4_4_;
  fVar304 = auVar231._8_4_;
  fVar335 = auVar231._12_4_;
  uVar147 = *(ulong *)(prim + uVar146 * 0x16 + 6);
  fVar438 = (1.0 - auVar444._0_4_ * auVar184._0_4_) * auVar184._0_4_ + auVar184._0_4_;
  fVar160 = (1.0 - auVar444._4_4_ * fVar160) * fVar160 + fVar160;
  fVar304 = (1.0 - auVar444._8_4_ * fVar304) * fVar304 + fVar304;
  fVar335 = (1.0 - auVar444._12_4_ * fVar335) * fVar335 + fVar335;
  local_528._0_2_ = (undefined2)uVar14;
  local_528._2_2_ = (undefined2)((ulong)uVar14 >> 0x10);
  local_528._4_2_ = (undefined2)((ulong)uVar14 >> 0x20);
  uStack_522 = (undefined2)((ulong)uVar14 >> 0x30);
  auVar187._0_12_ = auVar231._0_12_;
  auVar187._12_2_ = auVar231._6_2_;
  auVar187._14_2_ = uStack_522;
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._0_10_ = auVar231._0_10_;
  auVar186._10_2_ = local_528._4_2_;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._0_8_ = auVar231._0_8_;
  auVar185._8_2_ = auVar231._4_2_;
  auVar184._8_8_ = auVar185._8_8_;
  auVar184._6_2_ = local_528._2_2_;
  auVar184._4_2_ = auVar231._2_2_;
  auVar188._0_4_ = (float)(int)(short)local_528._0_2_;
  fVar222 = (float)(auVar184._4_4_ >> 0x10);
  auVar166._0_8_ = CONCAT44(fVar222,auVar188._0_4_);
  auVar166._8_4_ = (float)(auVar185._8_4_ >> 0x10);
  p00_1.field_0.i[0]._0_2_ = (undefined2)uVar15;
  p00_1.field_0.i[0]._2_2_ = (undefined2)((ulong)uVar15 >> 0x10);
  p00_1.field_0.i[1]._0_2_ = (undefined2)((ulong)uVar15 >> 0x20);
  p00_1.field_0.i[1]._2_2_ = (undefined2)((ulong)uVar15 >> 0x30);
  auVar313._12_2_ = (short)((uint)fVar227 >> 0x10);
  auVar313._0_12_ = auVar308;
  auVar313._14_2_ = p00_1.field_0.i[1]._2_2_;
  auVar312._12_4_ = auVar313._12_4_;
  auVar312._0_10_ = auVar308._0_10_;
  auVar312._10_2_ = p00_1.field_0.i[1]._0_2_;
  auVar311._10_6_ = auVar312._10_6_;
  auVar311._8_2_ = SUB42(fVar227,0);
  auVar311._0_8_ = auVar308._0_8_;
  auVar310._8_8_ = auVar311._8_8_;
  auVar310._6_2_ = p00_1.field_0.i[0]._2_2_;
  auVar310._4_2_ = (short)((uint)auVar310._0_4_ >> 0x10);
  p01.field_0.i[0]._0_2_ = (undefined2)uVar16;
  p01.field_0.i[0]._2_2_ = (undefined2)((ulong)uVar16 >> 0x10);
  p01.field_0.i[1]._0_2_ = (undefined2)((ulong)uVar16 >> 0x20);
  p01.field_0.i[1]._2_2_ = (undefined2)((ulong)uVar16 >> 0x30);
  auVar191._12_2_ = (short)((uint)fVar222 >> 0x10);
  auVar191._0_12_ = auVar166;
  auVar191._14_2_ = p01.field_0.i[1]._2_2_;
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._0_10_ = auVar166._0_10_;
  auVar190._10_2_ = p01.field_0.i[1]._0_2_;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = SUB42(fVar222,0);
  auVar189._0_8_ = auVar166._0_8_;
  auVar188._8_8_ = auVar189._8_8_;
  auVar188._6_2_ = p01.field_0.i[0]._2_2_;
  auVar188._4_2_ = (short)((uint)auVar188._0_4_ >> 0x10);
  auVar192._0_4_ = (float)(int)(short)p01.field_0.i[0]._0_2_;
  fVar227 = (float)(auVar188._4_4_ >> 0x10);
  auVar167._0_8_ = CONCAT44(fVar227,auVar192._0_4_);
  auVar167._8_4_ = (float)(auVar189._8_4_ >> 0x10);
  auVar376._12_2_ = (short)((uint)fVar386 >> 0x10);
  auVar376._0_12_ = auVar372;
  auVar376._14_2_ = (short)((ulong)uVar17 >> 0x30);
  auVar375._12_4_ = auVar376._12_4_;
  auVar375._0_10_ = auVar372._0_10_;
  auVar375._10_2_ = (short)((ulong)uVar17 >> 0x20);
  auVar374._10_6_ = auVar375._10_6_;
  auVar374._8_2_ = SUB42(fVar386,0);
  auVar374._0_8_ = auVar372._0_8_;
  auVar373._8_8_ = auVar374._8_8_;
  auVar373._6_2_ = (short)((ulong)uVar17 >> 0x10);
  auVar373._4_2_ = (short)((uint)auVar373._0_4_ >> 0x10);
  auVar195._12_2_ = (short)((uint)fVar227 >> 0x10);
  auVar195._0_12_ = auVar167;
  auVar195._14_2_ = (short)((ulong)uVar18 >> 0x30);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._0_10_ = auVar167._0_10_;
  auVar194._10_2_ = (short)((ulong)uVar18 >> 0x20);
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = SUB42(fVar227,0);
  auVar193._0_8_ = auVar167._0_8_;
  auVar192._8_8_ = auVar193._8_8_;
  auVar192._6_2_ = (short)((ulong)uVar18 >> 0x10);
  auVar192._4_2_ = (short)((uint)auVar192._0_4_ >> 0x10);
  fVar229 = (float)(auVar192._4_4_ >> 0x10);
  fVar306 = (float)(auVar193._8_4_ >> 0x10);
  uVar221 = (undefined2)(uVar147 >> 0x30);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar147;
  auVar234._12_2_ = uVar221;
  auVar234._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar147 >> 0x20);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar147;
  auVar233._10_2_ = uVar221;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._8_2_ = uVar221;
  auVar232._0_8_ = uVar147;
  uVar221 = (undefined2)(uVar147 >> 0x10);
  auVar96._4_8_ = auVar232._8_8_;
  auVar96._2_2_ = uVar221;
  auVar96._0_2_ = uVar221;
  uVar19 = *(ulong *)(prim + uVar146 * 0x14 + 6);
  uVar221 = (undefined2)(uVar19 >> 0x30);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar19;
  auVar198._12_2_ = uVar221;
  auVar198._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar19 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar19;
  auVar197._10_2_ = uVar221;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar221;
  auVar196._0_8_ = uVar19;
  uVar221 = (undefined2)(uVar19 >> 0x10);
  auVar97._4_8_ = auVar196._8_8_;
  auVar97._2_2_ = uVar221;
  auVar97._0_2_ = uVar221;
  fVar230 = (float)(auVar97._0_4_ >> 0x10);
  fVar325 = (float)(auVar196._8_4_ >> 0x10);
  uVar20 = *(ulong *)(prim + uVar146 * 0x18 + 6);
  uVar221 = (undefined2)(uVar20 >> 0x30);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar20;
  auVar237._12_2_ = uVar221;
  auVar237._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar20 >> 0x20);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar20;
  auVar236._10_2_ = uVar221;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._8_2_ = uVar221;
  auVar235._0_8_ = uVar20;
  uVar221 = (undefined2)(uVar20 >> 0x10);
  auVar98._4_8_ = auVar235._8_8_;
  auVar98._2_2_ = uVar221;
  auVar98._0_2_ = uVar221;
  uVar21 = *(ulong *)(prim + uVar146 * 0x1d + 6);
  uVar221 = (undefined2)(uVar21 >> 0x30);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar21;
  auVar201._12_2_ = uVar221;
  auVar201._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar21 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar21;
  auVar200._10_2_ = uVar221;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar221;
  auVar199._0_8_ = uVar21;
  uVar221 = (undefined2)(uVar21 >> 0x10);
  auVar99._4_8_ = auVar199._8_8_;
  auVar99._2_2_ = uVar221;
  auVar99._0_2_ = uVar221;
  fVar261 = (float)(auVar99._0_4_ >> 0x10);
  fVar326 = (float)(auVar199._8_4_ >> 0x10);
  uVar22 = *(ulong *)(prim + uVar146 * 0x21 + 6);
  uVar221 = (undefined2)(uVar22 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar22;
  auVar240._12_2_ = uVar221;
  auVar240._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar22 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar22;
  auVar239._10_2_ = uVar221;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar221;
  auVar238._0_8_ = uVar22;
  uVar221 = (undefined2)(uVar22 >> 0x10);
  auVar100._4_8_ = auVar238._8_8_;
  auVar100._2_2_ = uVar221;
  auVar100._0_2_ = uVar221;
  uVar23 = *(ulong *)(prim + uVar146 * 0x1f + 6);
  uVar221 = (undefined2)(uVar23 >> 0x30);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar23;
  auVar204._12_2_ = uVar221;
  auVar204._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar23 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar23;
  auVar203._10_2_ = uVar221;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar221;
  auVar202._0_8_ = uVar23;
  uVar221 = (undefined2)(uVar23 >> 0x10);
  auVar101._4_8_ = auVar202._8_8_;
  auVar101._2_2_ = uVar221;
  auVar101._0_2_ = uVar221;
  fVar450 = (float)(auVar101._0_4_ >> 0x10);
  fVar453 = (float)(auVar202._8_4_ >> 0x10);
  uVar24 = *(ulong *)(prim + uVar146 * 0x23 + 6);
  uVar221 = (undefined2)(uVar24 >> 0x30);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar24;
  auVar207._12_2_ = uVar221;
  auVar207._14_2_ = uVar221;
  uVar221 = (undefined2)(uVar24 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar24;
  auVar206._10_2_ = uVar221;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar221;
  auVar205._0_8_ = uVar24;
  uVar221 = (undefined2)(uVar24 >> 0x10);
  auVar102._4_8_ = auVar205._8_8_;
  auVar102._2_2_ = uVar221;
  auVar102._0_2_ = uVar221;
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar314._0_8_ =
       CONCAT44(((((float)(auVar310._4_4_ >> 0x10) - fVar222) * fVar486 + fVar222) - fVar499) *
                fVar350,((((float)(int)(short)p00_1.field_0.i[0]._0_2_ - auVar188._0_4_) * fVar486 +
                         auVar188._0_4_) - fVar359) * fVar348);
  auVar314._8_4_ =
       ((((float)(auVar311._8_4_ >> 0x10) - auVar166._8_4_) * fVar486 + auVar166._8_4_) - fVar369) *
       fVar460;
  auVar314._12_4_ =
       ((((float)(auVar312._12_4_ >> 0x10) - (float)(auVar186._12_4_ >> 0x10)) * fVar486 +
        (float)(auVar186._12_4_ >> 0x10)) - fVar371) * fVar355;
  auVar377._0_4_ =
       ((((float)(int)(short)uVar17 - auVar192._0_4_) * fVar486 + auVar192._0_4_) - fVar359) *
       fVar348;
  auVar377._4_4_ =
       ((((float)(auVar373._4_4_ >> 0x10) - fVar227) * fVar486 + fVar227) - fVar499) * fVar350;
  auVar377._8_4_ =
       ((((float)(auVar374._8_4_ >> 0x10) - auVar167._8_4_) * fVar486 + auVar167._8_4_) - fVar369) *
       fVar460;
  auVar377._12_4_ =
       ((((float)(auVar375._12_4_ >> 0x10) - (float)(auVar190._12_4_ >> 0x10)) * fVar486 +
        (float)(auVar190._12_4_ >> 0x10)) - fVar371) * fVar355;
  auVar390._0_8_ =
       CONCAT44(((((float)(auVar96._0_4_ >> 0x10) - fVar229) * fVar486 + fVar229) - fVar386) *
                fVar159,((((float)(int)(short)uVar147 - (float)(int)(short)uVar18) * fVar486 +
                         (float)(int)(short)uVar18) - auVar373._0_4_) * fVar477);
  auVar390._8_4_ =
       ((((float)(auVar232._8_4_ >> 0x10) - fVar306) * fVar486 + fVar306) - auVar372._8_4_) *
       fVar262;
  auVar390._12_4_ =
       ((((float)(auVar233._12_4_ >> 0x10) - (float)(auVar194._12_4_ >> 0x10)) * fVar486 +
        (float)(auVar194._12_4_ >> 0x10)) - fVar387) * fVar328;
  auVar405._0_4_ =
       ((((float)(int)(short)uVar20 - (float)(int)(short)uVar19) * fVar486 +
        (float)(int)(short)uVar19) - auVar373._0_4_) * fVar477;
  auVar405._4_4_ =
       ((((float)(auVar98._0_4_ >> 0x10) - fVar230) * fVar486 + fVar230) - fVar386) * fVar159;
  auVar405._8_4_ =
       ((((float)(auVar235._8_4_ >> 0x10) - fVar325) * fVar486 + fVar325) - auVar372._8_4_) *
       fVar262;
  auVar405._12_4_ =
       ((((float)(auVar236._12_4_ >> 0x10) - (float)(auVar197._12_4_ >> 0x10)) * fVar486 +
        (float)(auVar197._12_4_ >> 0x10)) - fVar387) * fVar328;
  auVar424._0_8_ =
       CONCAT44(((((float)(auVar100._0_4_ >> 0x10) - fVar261) * fVar486 + fVar261) - fVar411) *
                fVar160,((((float)(int)(short)uVar22 - (float)(int)(short)uVar21) * fVar486 +
                         (float)(int)(short)uVar21) - fVar367) * fVar438);
  auVar424._8_4_ =
       ((((float)(auVar238._8_4_ >> 0x10) - fVar326) * fVar486 + fVar326) - fVar430) * fVar304;
  auVar424._12_4_ =
       ((((float)(auVar239._12_4_ >> 0x10) - (float)(auVar200._12_4_ >> 0x10)) * fVar486 +
        (float)(auVar200._12_4_ >> 0x10)) - fVar470) * fVar335;
  auVar445._0_4_ =
       ((((float)(int)(short)uVar24 - (float)(int)(short)uVar23) * fVar486 +
        (float)(int)(short)uVar23) - fVar367) * fVar438;
  auVar445._4_4_ =
       ((((float)(auVar102._0_4_ >> 0x10) - fVar450) * fVar486 + fVar450) - fVar411) * fVar160;
  auVar445._8_4_ =
       ((((float)(auVar205._8_4_ >> 0x10) - fVar453) * fVar486 + fVar453) - fVar430) * fVar304;
  auVar445._12_4_ =
       ((((float)(auVar206._12_4_ >> 0x10) - (float)(auVar203._12_4_ >> 0x10)) * fVar486 +
        (float)(auVar203._12_4_ >> 0x10)) - fVar470) * fVar335;
  auVar300._8_4_ = auVar314._8_4_;
  auVar300._0_8_ = auVar314._0_8_;
  auVar300._12_4_ = auVar314._12_4_;
  auVar301 = minps(auVar300,auVar377);
  auVar284._8_4_ = auVar390._8_4_;
  auVar284._0_8_ = auVar390._0_8_;
  auVar284._12_4_ = auVar390._12_4_;
  auVar231 = minps(auVar284,auVar405);
  auVar301 = maxps(auVar301,auVar231);
  auVar285._8_4_ = auVar424._8_4_;
  auVar285._0_8_ = auVar424._0_8_;
  auVar285._12_4_ = auVar424._12_4_;
  auVar231 = minps(auVar285,auVar445);
  auVar241._4_4_ = uVar10;
  auVar241._0_4_ = uVar10;
  auVar241._8_4_ = uVar10;
  auVar241._12_4_ = uVar10;
  auVar231 = maxps(auVar231,auVar241);
  auVar231 = maxps(auVar301,auVar231);
  fVar477 = auVar231._0_4_ * 0.99999964;
  fVar159 = auVar231._4_4_ * 0.99999964;
  fVar160 = auVar231._8_4_ * 0.99999964;
  fVar222 = auVar231._12_4_ * 0.99999964;
  auVar231 = maxps(auVar314,auVar377);
  auVar301 = maxps(auVar390,auVar405);
  auVar231 = minps(auVar231,auVar301);
  auVar301 = maxps(auVar424,auVar445);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar242._4_4_ = uVar10;
  auVar242._0_4_ = uVar10;
  auVar242._8_4_ = uVar10;
  auVar242._12_4_ = uVar10;
  auVar301 = minps(auVar301,auVar242);
  auVar231 = minps(auVar231,auVar301);
  auVar243._0_4_ = -(uint)(PVar25 != (Primitive)0x0 && fVar477 <= auVar231._0_4_ * 1.0000004);
  auVar243._4_4_ = -(uint)(1 < (byte)PVar25 && fVar159 <= auVar231._4_4_ * 1.0000004);
  auVar243._8_4_ = -(uint)(2 < (byte)PVar25 && fVar160 <= auVar231._8_4_ * 1.0000004);
  auVar243._12_4_ = -(uint)(3 < (byte)PVar25 && fVar222 <= auVar231._12_4_ * 1.0000004);
  uVar154 = movmskps((int)(uVar146 * 0x23),auVar243);
  local_398 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar38 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar39 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar40 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_390 = prim;
LAB_003d4f3d:
  if (uVar154 == 0) {
LAB_003d7578:
    return uVar154 != 0;
  }
  lVar151 = 0;
  if (uVar154 != 0) {
    for (; (uVar154 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
    }
  }
  uVar155 = *(uint *)(local_390 + 2);
  uVar156 = *(uint *)(local_390 + lVar151 * 4 + 6);
  pGVar31 = (context->scene->geometries).items[uVar155].ptr;
  fVar227 = pGVar31->fnumTimeSegments;
  fVar229 = (pGVar31->time_range).lower;
  fVar230 = ((*(float *)(ray + k * 4 + 0x70) - fVar229) / ((pGVar31->time_range).upper - fVar229)) *
            fVar227;
  fVar229 = floorf(fVar230);
  fVar227 = fVar227 + -1.0;
  if (fVar227 <= fVar229) {
    fVar229 = fVar227;
  }
  fVar227 = 0.0;
  if (0.0 <= fVar229) {
    fVar227 = fVar229;
  }
  uVar147 = (ulong)*(uint *)(*(long *)&pGVar31->field_0x58 +
                            (ulong)uVar156 *
                            pGVar31[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var32 = pGVar31[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar152 = (long)(int)fVar227 * 0x38;
  lVar33 = *(long *)(_Var32 + lVar152);
  lVar34 = *(long *)(_Var32 + 0x10 + lVar152);
  pfVar3 = (float *)(lVar33 + lVar34 * uVar147);
  fVar229 = *pfVar3;
  fVar261 = pfVar3[1];
  fVar262 = pfVar3[2];
  fVar304 = pfVar3[3];
  lVar151 = uVar147 + 1;
  pauVar4 = (undefined1 (*) [12])(lVar33 + lVar34 * lVar151);
  auVar82 = *pauVar4;
  fVar306 = *(float *)pauVar4[1];
  lVar1 = uVar147 + 2;
  pfVar3 = (float *)(lVar33 + lVar34 * lVar1);
  fVar325 = *pfVar3;
  fVar326 = pfVar3[1];
  fVar328 = pfVar3[2];
  fVar335 = pfVar3[3];
  lVar2 = uVar147 + 3;
  pfVar3 = (float *)(lVar33 + lVar34 * lVar2);
  fVar348 = *pfVar3;
  fVar350 = pfVar3[1];
  fVar460 = pfVar3[2];
  fVar355 = pfVar3[3];
  lVar33 = *(long *)&pGVar31[4].fnumTimeSegments;
  lVar34 = *(long *)(lVar33 + lVar152);
  lVar35 = *(long *)(lVar33 + 0x10 + lVar152);
  pfVar3 = (float *)(lVar34 + lVar35 * uVar147);
  fVar367 = *pfVar3;
  fVar411 = pfVar3[1];
  fVar430 = pfVar3[2];
  pfVar5 = (float *)(lVar34 + lVar35 * lVar151);
  fVar470 = *pfVar5;
  fVar359 = pfVar5[1];
  fVar438 = pfVar5[2];
  pfVar6 = (float *)(lVar34 + lVar35 * lVar1);
  fVar499 = *pfVar6;
  fVar369 = pfVar6[1];
  fVar371 = pfVar6[2];
  fVar230 = fVar230 - fVar227;
  pfVar7 = (float *)(lVar34 + lVar35 * lVar2);
  fVar227 = *pfVar7;
  fVar386 = pfVar7[1];
  fVar387 = pfVar7[2];
  fVar461 = *(float *)*pauVar4 * 0.0;
  fVar478 = *(float *)(*pauVar4 + 4) * 0.0;
  fVar486 = *(float *)(*pauVar4 + 8) * 0.0;
  fVar462 = (fVar325 * 0.5 + fVar348 * 0.0 + fVar461) - fVar229 * 0.5;
  fVar472 = (fVar326 * 0.5 + fVar350 * 0.0 + fVar478) - fVar261 * 0.5;
  fVar479 = (fVar328 * 0.5 + fVar460 * 0.0 + fVar486) - fVar262 * 0.5;
  fVar484 = (fVar335 * 0.5 + fVar355 * 0.0 + fVar306 * 0.0) - fVar304 * 0.5;
  fVar388 = (fVar499 * 0.5 + fVar227 * 0.0 + fVar470 * 0.0) - fVar367 * 0.5;
  fVar398 = (fVar369 * 0.5 + fVar386 * 0.0 + fVar359 * 0.0) - fVar411 * 0.5;
  fVar400 = (fVar371 * 0.5 + fVar387 * 0.0 + fVar438 * 0.0) - fVar430 * 0.5;
  fVar450 = fVar325 * 0.0 + fVar348 * -0.0 + *(float *)*pauVar4 + fVar229 * -0.0;
  fVar453 = fVar326 * 0.0 + fVar350 * -0.0 + *(float *)(*pauVar4 + 4) + fVar261 * -0.0;
  fVar457 = fVar328 * 0.0 + fVar460 * -0.0 + *(float *)(*pauVar4 + 8) + fVar262 * -0.0;
  fVar305 = fVar335 * 0.0 + fVar355 * -0.0 + fVar306 + fVar304 * -0.0;
  fVar463 = fVar499 * 0.0 + fVar227 * -0.0 + fVar470 + fVar367 * -0.0;
  fVar473 = fVar369 * 0.0 + fVar386 * -0.0 + fVar359 + fVar411 * -0.0;
  fVar480 = fVar371 * 0.0 + fVar387 * -0.0 + fVar438 + fVar430 * -0.0;
  fVar485 = pfVar6[3] * 0.0 + pfVar7[3] * -0.0 + pfVar5[3] + pfVar3[3] * -0.0;
  fVar471 = fVar348 * -0.0 + fVar325 + fVar461 + fVar229 * -0.0;
  fVar483 = fVar350 * -0.0 + fVar326 + fVar478 + fVar261 * -0.0;
  fVar329 = fVar460 * -0.0 + fVar328 + fVar486 + fVar262 * -0.0;
  fVar333 = fVar355 * -0.0 + fVar335 + fVar306 * 0.0 + fVar304 * -0.0;
  p00_1.field_0.i[0] = auVar82._0_4_;
  p00_1.field_0.i[1] = auVar82._4_4_;
  p00_1.field_0.i[2] = auVar82._8_4_;
  fVar461 = fVar229 * 0.0 + ((fVar348 * 0.5 + fVar325 * 0.0) - p00_1.field_0.v[0] * 0.5);
  fVar478 = fVar261 * 0.0 + ((fVar350 * 0.5 + fVar326 * 0.0) - p00_1.field_0.v[1] * 0.5);
  fVar486 = fVar262 * 0.0 + ((fVar460 * 0.5 + fVar328 * 0.0) - p00_1.field_0.v[2] * 0.5);
  fVar355 = fVar304 * 0.0 + ((fVar355 * 0.5 + fVar335 * 0.0) - fVar306 * 0.5);
  fVar262 = fVar227 * -0.0 + fVar499 + fVar470 * 0.0 + fVar367 * -0.0;
  fVar304 = fVar386 * -0.0 + fVar369 + fVar359 * 0.0 + fVar411 * -0.0;
  fVar306 = fVar387 * -0.0 + fVar371 + fVar438 * 0.0 + fVar430 * -0.0;
  fVar227 = fVar367 * 0.0 + ((fVar227 * 0.5 + fVar499 * 0.0) - fVar470 * 0.5);
  fVar229 = fVar411 * 0.0 + ((fVar386 * 0.5 + fVar369 * 0.0) - fVar359 * 0.5);
  fVar261 = fVar430 * 0.0 + ((fVar387 * 0.5 + fVar371 * 0.0) - fVar438 * 0.5);
  fVar439 = fVar472 * fVar463 - fVar473 * fVar462;
  fVar473 = fVar479 * fVar473 - fVar480 * fVar472;
  fVar454 = fVar462 * fVar480 - fVar463 * fVar479;
  fVar359 = fVar472 * fVar388 - fVar398 * fVar462;
  fVar499 = fVar479 * fVar398 - fVar400 * fVar472;
  fVar369 = fVar462 * fVar400 - fVar388 * fVar479;
  fVar387 = fVar478 * fVar262 - fVar304 * fVar461;
  fVar480 = fVar486 * fVar304 - fVar306 * fVar478;
  fVar414 = fVar461 * fVar306 - fVar262 * fVar486;
  fVar411 = fVar478 * fVar227 - fVar229 * fVar461;
  fVar430 = fVar486 * fVar229 - fVar261 * fVar478;
  fVar470 = fVar461 * fVar261 - fVar227 * fVar486;
  fVar367 = fVar454 * fVar454 + fVar473 * fVar473 + fVar439 * fVar439;
  auVar301 = ZEXT416((uint)fVar367);
  auVar231 = rsqrtss(ZEXT416((uint)fVar367),auVar301);
  fVar227 = auVar231._0_4_;
  fVar420 = fVar227 * 1.5 - fVar227 * fVar227 * fVar367 * 0.5 * fVar227;
  fVar371 = fVar439 * fVar359 + fVar454 * fVar369 + fVar473 * fVar499;
  auVar231 = rcpss(auVar301,auVar301);
  fVar386 = (2.0 - fVar367 * auVar231._0_4_) * auVar231._0_4_;
  fVar438 = fVar414 * fVar414 + fVar480 * fVar480 + fVar387 * fVar387;
  auVar301 = ZEXT416((uint)fVar438);
  auVar231 = rsqrtss(ZEXT416((uint)fVar438),auVar301);
  fVar227 = auVar231._0_4_;
  fVar440 = fVar227 * 1.5 - fVar227 * fVar227 * fVar438 * 0.5 * fVar227;
  fVar487 = fVar387 * fVar411 + fVar414 * fVar470 + fVar480 * fVar430;
  lVar34 = *(long *)(_Var32 + 0x38 + lVar152);
  lVar35 = *(long *)(_Var32 + 0x48 + lVar152);
  pauVar8 = (undefined1 (*) [16])(lVar34 + lVar35 * uVar147);
  auVar82 = *(undefined1 (*) [12])*pauVar8;
  fVar227 = *(float *)(*pauVar8 + 0xc);
  auVar231 = *pauVar8;
  pfVar3 = (float *)(lVar34 + lVar35 * lVar151);
  fVar229 = *pfVar3;
  fVar261 = pfVar3[1];
  fVar262 = pfVar3[2];
  fVar304 = pfVar3[3];
  pfVar3 = (float *)(lVar34 + lVar35 * lVar1);
  fVar306 = *pfVar3;
  fVar325 = pfVar3[1];
  fVar326 = pfVar3[2];
  fVar328 = pfVar3[3];
  auVar301 = rcpss(auVar301,auVar301);
  pfVar3 = (float *)(lVar34 + lVar35 * lVar2);
  fVar335 = *pfVar3;
  fVar348 = pfVar3[1];
  fVar350 = pfVar3[2];
  fVar460 = pfVar3[3];
  fVar488 = (2.0 - fVar438 * auVar301._0_4_) * auVar301._0_4_;
  fVar464 = fVar305 * fVar473 * fVar420;
  fVar474 = fVar305 * fVar454 * fVar420;
  fVar481 = fVar305 * fVar439 * fVar420;
  fVar388 = fVar450 - fVar464;
  fVar400 = fVar453 - fVar474;
  fVar463 = fVar457 - fVar481;
  fVar441 = fVar305 * fVar386 * (fVar367 * fVar499 - fVar371 * fVar473) * fVar420 +
            fVar484 * fVar473 * fVar420;
  fVar451 = fVar305 * fVar386 * (fVar367 * fVar369 - fVar371 * fVar454) * fVar420 +
            fVar484 * fVar454 * fVar420;
  fVar455 = fVar305 * fVar386 * (fVar367 * fVar359 - fVar371 * fVar439) * fVar420 +
            fVar484 * fVar439 * fVar420;
  fVar464 = fVar464 + fVar450;
  fVar474 = fVar474 + fVar453;
  fVar481 = fVar481 + fVar457;
  fVar450 = fVar333 * fVar480 * fVar440;
  fVar453 = fVar333 * fVar414 * fVar440;
  fVar457 = fVar333 * fVar387 * fVar440;
  fVar398 = fVar471 - fVar450;
  fVar439 = fVar483 - fVar453;
  fVar473 = fVar329 - fVar457;
  fVar307 = fVar333 * fVar488 * (fVar438 * fVar430 - fVar487 * fVar480) * fVar440 +
            fVar355 * fVar480 * fVar440;
  fVar327 = fVar333 * fVar488 * (fVar438 * fVar470 - fVar487 * fVar414) * fVar440 +
            fVar355 * fVar414 * fVar440;
  fVar330 = fVar333 * fVar488 * (fVar438 * fVar411 - fVar487 * fVar387) * fVar440 +
            fVar355 * fVar387 * fVar440;
  fVar450 = fVar450 + fVar471;
  fVar453 = fVar453 + fVar483;
  fVar457 = fVar457 + fVar329;
  fVar487 = (fVar306 * 0.5 + fVar335 * 0.0 + fVar229 * 0.0) - *(float *)*pauVar8 * 0.5;
  fVar488 = (fVar325 * 0.5 + fVar348 * 0.0 + fVar261 * 0.0) - *(float *)(*pauVar8 + 4) * 0.5;
  fVar331 = (fVar326 * 0.5 + fVar350 * 0.0 + fVar262 * 0.0) - *(float *)(*pauVar8 + 8) * 0.5;
  fVar334 = (fVar328 * 0.5 + fVar460 * 0.0 + fVar304 * 0.0) - fVar227 * 0.5;
  lVar34 = *(long *)(lVar33 + 0x38 + lVar152);
  lVar33 = *(long *)(lVar33 + 0x48 + lVar152);
  uVar147 = uVar147 * lVar33;
  pfVar3 = (float *)(lVar34 + lVar33 * lVar2);
  fVar355 = *pfVar3;
  fVar367 = pfVar3[1];
  fVar411 = pfVar3[2];
  pfVar5 = (float *)(lVar34 + lVar1 * lVar33);
  fVar430 = *pfVar5;
  fVar470 = pfVar5[1];
  fVar359 = pfVar5[2];
  pfVar6 = (float *)(lVar34 + lVar151 * lVar33);
  fVar438 = *pfVar6;
  fVar499 = pfVar6[1];
  fVar369 = pfVar6[2];
  pfVar7 = (float *)(lVar34 + uVar147);
  fVar371 = *pfVar7;
  fVar386 = pfVar7[1];
  fVar387 = pfVar7[2];
  fVar403 = (fVar430 * 0.5 + fVar355 * 0.0 + fVar438 * 0.0) - fVar371 * 0.5;
  fVar412 = (fVar470 * 0.5 + fVar367 * 0.0 + fVar499 * 0.0) - fVar386 * 0.5;
  fVar415 = (fVar359 * 0.5 + fVar411 * 0.0 + fVar369 * 0.0) - fVar387 * 0.5;
  p00_1.field_0.i[0] = auVar82._0_4_;
  p00_1.field_0.i[1] = auVar82._4_4_;
  p00_1.field_0.i[2] = auVar82._8_4_;
  fVar480 = fVar306 * 0.0 + fVar335 * -0.0 + fVar229 + p00_1.field_0.v[0] * -0.0;
  fVar414 = fVar325 * 0.0 + fVar348 * -0.0 + fVar261 + p00_1.field_0.v[1] * -0.0;
  fVar440 = fVar326 * 0.0 + fVar350 * -0.0 + fVar262 + p00_1.field_0.v[2] * -0.0;
  fVar454 = fVar328 * 0.0 + fVar460 * -0.0 + fVar304 + fVar227 * -0.0;
  fVar471 = fVar335 * -0.0 + fVar306 + fVar229 * 0.0 + p00_1.field_0.v[0] * -0.0;
  fVar483 = fVar348 * -0.0 + fVar325 + fVar261 * 0.0 + p00_1.field_0.v[1] * -0.0;
  fVar329 = fVar350 * -0.0 + fVar326 + fVar262 * 0.0 + p00_1.field_0.v[2] * -0.0;
  fVar333 = fVar460 * -0.0 + fVar328 + fVar304 * 0.0 + fVar227 * -0.0;
  fVar229 = p00_1.field_0.v[0] * 0.0 + ((fVar335 * 0.5 + fVar306 * 0.0) - fVar229 * 0.5);
  fVar261 = p00_1.field_0.v[1] * 0.0 + ((fVar348 * 0.5 + fVar325 * 0.0) - fVar261 * 0.5);
  fVar262 = p00_1.field_0.v[2] * 0.0 + ((fVar350 * 0.5 + fVar326 * 0.0) - fVar262 * 0.5);
  fVar227 = fVar227 * 0.0 + ((fVar460 * 0.5 + fVar328 * 0.0) - fVar304 * 0.5);
  fVar304 = fVar430 * 0.0 + fVar355 * -0.0 + fVar438 + fVar371 * -0.0;
  fVar325 = fVar470 * 0.0 + fVar367 * -0.0 + fVar499 + fVar386 * -0.0;
  fVar348 = fVar359 * 0.0 + fVar411 * -0.0 + fVar369 + fVar387 * -0.0;
  fVar458 = pfVar5[3] * 0.0 + pfVar3[3] * -0.0 + pfVar6[3] + pfVar7[3] * -0.0;
  fVar306 = fVar355 * -0.0 + fVar430 + fVar438 * 0.0 + fVar371 * -0.0;
  fVar326 = fVar367 * -0.0 + fVar470 + fVar499 * 0.0 + fVar386 * -0.0;
  fVar328 = fVar411 * -0.0 + fVar359 + fVar369 * 0.0 + fVar387 * -0.0;
  fVar335 = fVar371 * 0.0 + ((fVar355 * 0.5 + fVar430 * 0.0) - fVar438 * 0.5);
  fVar350 = fVar386 * 0.0 + ((fVar367 * 0.5 + fVar470 * 0.0) - fVar499 * 0.5);
  fVar411 = fVar387 * 0.0 + ((fVar411 * 0.5 + fVar359 * 0.0) - fVar369 * 0.5);
  fVar430 = fVar488 * fVar304 - fVar325 * fVar487;
  fVar470 = fVar331 * fVar325 - fVar348 * fVar488;
  fVar359 = fVar487 * fVar348 - fVar304 * fVar331;
  fVar304 = fVar488 * fVar403 - fVar412 * fVar487;
  fVar325 = fVar331 * fVar412 - fVar415 * fVar488;
  fVar348 = fVar487 * fVar415 - fVar403 * fVar331;
  fVar460 = fVar261 * fVar306 - fVar326 * fVar229;
  fVar355 = fVar262 * fVar326 - fVar328 * fVar261;
  fVar367 = fVar229 * fVar328 - fVar306 * fVar262;
  fVar326 = fVar261 * fVar335 - fVar350 * fVar229;
  fVar328 = fVar262 * fVar350 - fVar411 * fVar261;
  fVar350 = fVar229 * fVar411 - fVar335 * fVar262;
  fVar411 = fVar359 * fVar359 + fVar470 * fVar470 + fVar430 * fVar430;
  auVar301 = ZEXT416((uint)fVar411);
  auVar446 = rsqrtss(ZEXT416((uint)fVar411),auVar301);
  fVar306 = auVar446._0_4_;
  fVar421 = fVar306 * 1.5 - fVar306 * fVar306 * fVar411 * 0.5 * fVar306;
  fVar371 = fVar430 * fVar304 + fVar359 * fVar348 + fVar470 * fVar325;
  auVar301 = rcpss(auVar301,auVar301);
  fVar306 = (2.0 - fVar411 * auVar301._0_4_) * auVar301._0_4_;
  fVar386 = fVar367 * fVar367 + fVar355 * fVar355 + fVar460 * fVar460;
  auVar301 = ZEXT416((uint)fVar386);
  auVar446 = rsqrtss(ZEXT416((uint)fVar386),auVar301);
  fVar335 = auVar446._0_4_;
  fVar387 = fVar335 * 1.5 - fVar335 * fVar335 * fVar386 * 0.5 * fVar335;
  fVar403 = fVar460 * fVar326 + fVar367 * fVar350 + fVar355 * fVar328;
  auVar301 = rcpss(auVar301,auVar301);
  fVar412 = (2.0 - fVar386 * auVar301._0_4_) * auVar301._0_4_;
  fVar438 = fVar454 * fVar470 * fVar421;
  fVar499 = fVar454 * fVar359 * fVar421;
  fVar369 = fVar454 * fVar430 * fVar421;
  fVar335 = fVar454 * fVar306 * (fVar411 * fVar325 - fVar371 * fVar470) * fVar421 +
            fVar334 * fVar470 * fVar421;
  fVar348 = fVar454 * fVar306 * (fVar411 * fVar348 - fVar371 * fVar359) * fVar421 +
            fVar334 * fVar359 * fVar421;
  fVar359 = fVar454 * fVar306 * (fVar411 * fVar304 - fVar371 * fVar430) * fVar421 +
            fVar334 * fVar430 * fVar421;
  fVar411 = fVar480 - fVar438;
  fVar430 = fVar414 - fVar499;
  fVar470 = fVar440 - fVar369;
  fVar438 = fVar438 + fVar480;
  fVar499 = fVar499 + fVar414;
  fVar369 = fVar369 + fVar440;
  fVar304 = fVar333 * fVar355 * fVar387;
  fVar306 = fVar333 * fVar367 * fVar387;
  fVar325 = fVar333 * fVar460 * fVar387;
  fVar371 = fVar333 * fVar412 * (fVar386 * fVar328 - fVar403 * fVar355) * fVar387 +
            fVar227 * fVar355 * fVar387;
  fVar350 = fVar333 * fVar412 * (fVar386 * fVar350 - fVar403 * fVar367) * fVar387 +
            fVar227 * fVar367 * fVar387;
  fVar386 = fVar333 * fVar412 * (fVar386 * fVar326 - fVar403 * fVar460) * fVar387 +
            fVar227 * fVar460 * fVar387;
  fVar227 = fVar471 - fVar304;
  fVar326 = fVar483 - fVar306;
  fVar328 = fVar329 - fVar325;
  fVar304 = fVar304 + fVar471;
  fVar306 = fVar306 + fVar483;
  fVar325 = fVar325 + fVar329;
  fVar403 = 1.0 - fVar230;
  fVar422 = fVar388 * fVar403 + fVar411 * fVar230;
  fVar431 = fVar400 * fVar403 + fVar430 * fVar230;
  fVar433 = fVar463 * fVar403 + fVar470 * fVar230;
  fVar465 = ((fVar462 - fVar441) * 0.33333334 + fVar388) * fVar403 +
            ((fVar487 - fVar335) * 0.33333334 + fVar411) * fVar230;
  fVar475 = ((fVar472 - fVar451) * 0.33333334 + fVar400) * fVar403 +
            ((fVar488 - fVar348) * 0.33333334 + fVar430) * fVar230;
  fVar482 = ((fVar479 - fVar455) * 0.33333334 + fVar463) * fVar403 +
            ((fVar331 - fVar359) * 0.33333334 + fVar470) * fVar230;
  fVar333 = (fVar398 - (fVar461 - fVar307) * 0.33333334) * fVar403 +
            (fVar227 - (fVar229 - fVar371) * 0.33333334) * fVar230;
  fVar400 = (fVar439 - (fVar478 - fVar327) * 0.33333334) * fVar403 +
            (fVar326 - (fVar261 - fVar350) * 0.33333334) * fVar230;
  fVar463 = (fVar473 - (fVar486 - fVar330) * 0.33333334) * fVar403 +
            (fVar328 - (fVar262 - fVar386) * 0.33333334) * fVar230;
  fVar460 = fVar398 * fVar403 + fVar227 * fVar230;
  fVar367 = fVar439 * fVar403 + fVar326 * fVar230;
  fVar430 = fVar473 * fVar403 + fVar328 * fVar230;
  fVar355 = fVar464 * fVar403 + fVar438 * fVar230;
  fVar411 = fVar474 * fVar403 + fVar499 * fVar230;
  fVar470 = fVar481 * fVar403 + fVar369 * fVar230;
  fVar439 = ((fVar441 + fVar462) * 0.33333334 + fVar464) * fVar403 +
            ((fVar335 + fVar487) * 0.33333334 + fVar438) * fVar230;
  fVar414 = ((fVar451 + fVar472) * 0.33333334 + fVar474) * fVar403 +
            ((fVar348 + fVar488) * 0.33333334 + fVar499) * fVar230;
  fVar487 = ((fVar455 + fVar479) * 0.33333334 + fVar481) * fVar403 +
            ((fVar359 + fVar331) * 0.33333334 + fVar369) * fVar230;
  fVar335 = (fVar450 - (fVar307 + fVar461) * 0.33333334) * fVar403 +
            (fVar304 - (fVar371 + fVar229) * 0.33333334) * fVar230;
  fVar348 = (fVar453 - (fVar327 + fVar478) * 0.33333334) * fVar403 +
            (fVar306 - (fVar350 + fVar261) * 0.33333334) * fVar230;
  fVar350 = (fVar457 - (fVar330 + fVar486) * 0.33333334) * fVar403 +
            (fVar325 - (fVar386 + fVar262) * 0.33333334) * fVar230;
  fVar488 = fVar403 * fVar450 + fVar230 * fVar304;
  fVar330 = fVar403 * fVar453 + fVar230 * fVar306;
  fVar331 = fVar403 * fVar457 + fVar230 * fVar325;
  fVar227 = *(float *)(ray + k * 4);
  fVar229 = *(float *)(ray + k * 4 + 0x10);
  fVar261 = *(float *)(ray + k * 4 + 0x20);
  fVar359 = fVar422 - fVar227;
  fVar438 = fVar431 - fVar229;
  fVar499 = fVar433 - fVar261;
  fVar262 = pre->ray_space[k].vx.field_0.m128[0];
  fVar304 = pre->ray_space[k].vx.field_0.m128[1];
  fVar306 = pre->ray_space[k].vy.field_0.m128[0];
  fVar325 = pre->ray_space[k].vy.field_0.m128[1];
  fVar326 = pre->ray_space[k].vz.field_0.m128[0];
  fVar328 = pre->ray_space[k].vz.field_0.m128[1];
  fVar412 = fVar359 * fVar262 + fVar438 * fVar306 + fVar499 * fVar326;
  fVar415 = fVar359 * fVar304 + fVar438 * fVar325 + fVar499 * fVar328;
  auVar208._4_4_ = fVar415;
  auVar208._0_4_ = fVar412;
  fVar369 = fVar465 - fVar227;
  fVar453 = fVar475 - fVar229;
  fVar483 = fVar482 - fVar261;
  fVar388 = fVar369 * fVar262 + fVar453 * fVar306 + fVar483 * fVar326;
  fVar398 = fVar369 * fVar304 + fVar453 * fVar325 + fVar483 * fVar328;
  auVar425._4_4_ = fVar398;
  auVar425._0_4_ = fVar388;
  fVar371 = fVar333 - fVar227;
  fVar457 = fVar400 - fVar229;
  fVar486 = fVar463 - fVar261;
  fVar386 = fVar371 * fVar262 + fVar457 * fVar306 + fVar486 * fVar326;
  fVar461 = fVar371 * fVar304 + fVar457 * fVar325 + fVar486 * fVar328;
  auVar244._4_4_ = fVar461;
  auVar244._0_4_ = fVar386;
  fVar387 = fVar460 - fVar227;
  fVar471 = fVar367 - fVar229;
  fVar329 = fVar430 - fVar261;
  fVar450 = fVar387 * fVar262 + fVar471 * fVar306 + fVar329 * fVar326;
  fVar478 = fVar387 * fVar304 + fVar471 * fVar325 + fVar329 * fVar328;
  auVar490._4_4_ = fVar478;
  auVar490._0_4_ = fVar450;
  fVar473 = fVar355 - fVar227;
  fVar440 = fVar411 - fVar229;
  fVar327 = fVar470 - fVar261;
  fVar480 = fVar473 * fVar262 + fVar440 * fVar306 + fVar327 * fVar326;
  fVar307 = fVar473 * fVar304 + fVar440 * fVar325 + fVar327 * fVar328;
  fVar441 = fVar439 - fVar227;
  fVar462 = fVar414 - fVar229;
  fVar474 = fVar487 - fVar261;
  fVar481 = fVar441 * fVar262 + fVar462 * fVar306 + fVar474 * fVar326;
  fVar476 = fVar441 * fVar304 + fVar462 * fVar325 + fVar474 * fVar328;
  auVar425._12_4_ = fVar476;
  auVar425._8_4_ = fVar481;
  fVar451 = fVar335 - fVar227;
  fVar464 = fVar348 - fVar229;
  fVar479 = fVar350 - fVar261;
  fVar455 = fVar451 * fVar262 + fVar464 * fVar306 + fVar479 * fVar326;
  fVar472 = fVar451 * fVar304 + fVar464 * fVar325 + fVar479 * fVar328;
  fVar227 = fVar488 - fVar227;
  fVar229 = fVar330 - fVar229;
  fVar261 = fVar331 - fVar261;
  fVar306 = fVar227 * fVar262 + fVar229 * fVar306 + fVar261 * fVar326;
  fVar304 = fVar227 * fVar304 + fVar229 * fVar325 + fVar261 * fVar328;
  auVar490._12_4_ = fVar304;
  auVar490._8_4_ = fVar306;
  auVar208._8_4_ = fVar480;
  auVar208._12_4_ = fVar307;
  auVar301 = minps(auVar208,auVar425);
  auVar244._8_4_ = fVar455;
  auVar244._12_4_ = fVar472;
  auVar446 = minps(auVar244,auVar490);
  auVar301 = minps(auVar301,auVar446);
  auVar245._4_4_ = fVar415;
  auVar245._0_4_ = fVar412;
  auVar245._8_4_ = fVar480;
  auVar245._12_4_ = fVar307;
  auVar446 = maxps(auVar245,auVar425);
  auVar286._4_4_ = fVar461;
  auVar286._0_4_ = fVar386;
  auVar286._8_4_ = fVar455;
  auVar286._12_4_ = fVar472;
  auVar287 = maxps(auVar286,auVar490);
  auVar246 = maxps(auVar446,auVar287);
  auVar41._4_8_ = auVar287._8_8_;
  auVar41._0_4_ = auVar301._4_4_;
  auVar288._0_8_ = auVar41._0_8_ << 0x20;
  auVar288._8_4_ = auVar301._8_4_;
  auVar288._12_4_ = auVar301._12_4_;
  auVar289._8_8_ = auVar301._8_8_;
  auVar289._0_8_ = auVar288._8_8_;
  auVar446 = minps(auVar301,auVar289);
  auVar42._4_8_ = auVar301._8_8_;
  auVar42._0_4_ = auVar246._4_4_;
  auVar290._0_8_ = auVar42._0_8_ << 0x20;
  auVar290._8_4_ = auVar246._8_4_;
  auVar290._12_4_ = auVar246._12_4_;
  auVar291._8_8_ = auVar246._8_8_;
  auVar291._0_8_ = auVar290._8_8_;
  auVar301 = maxps(auVar246,auVar291);
  auVar209._0_8_ = auVar446._0_8_ & 0x7fffffff7fffffff;
  auVar209._8_4_ = auVar446._8_4_ & 0x7fffffff;
  auVar209._12_4_ = auVar446._12_4_ & 0x7fffffff;
  auVar247._0_8_ = auVar301._0_8_ & 0x7fffffff7fffffff;
  auVar247._8_4_ = auVar301._8_4_ & 0x7fffffff;
  auVar247._12_4_ = auVar301._12_4_ & 0x7fffffff;
  auVar301 = maxps(auVar209,auVar247);
  fVar262 = auVar301._4_4_;
  if (auVar301._4_4_ <= auVar301._0_4_) {
    fVar262 = auVar301._0_4_;
  }
  fVar262 = fVar262 * 9.536743e-07;
  local_3a8._4_4_ = fVar472;
  local_3a8._0_4_ = fVar455;
  bVar150 = 0;
  uVar157 = 0;
  fVar325 = *(float *)(ray + k * 4 + 0x30);
  local_538.lower = 0.0;
  local_538.upper = 1.0;
  local_548._0_4_ = 0.0;
  local_548._4_4_ = 1.0;
  fStack_540 = 0.0;
  fStack_53c = 0.0;
LAB_003d5d94:
  do {
    fVar326 = 1.0 - (float)local_548._0_4_;
    fVar328 = 1.0 - (float)local_548._0_4_;
    fVar434 = 1.0 - (float)local_548._4_4_;
    fVar436 = 1.0 - (float)local_548._4_4_;
    fVar404 = fVar412 * fVar326 + fVar480 * (float)local_548._0_4_;
    fVar413 = fVar415 * fVar328 + fVar307 * (float)local_548._0_4_;
    fVar416 = fVar412 * fVar434 + fVar480 * (float)local_548._4_4_;
    fVar418 = fVar415 * fVar436 + fVar307 * (float)local_548._4_4_;
    fVar389 = fVar388 * fVar326 + fVar481 * (float)local_548._0_4_;
    fVar399 = fVar398 * fVar328 + fVar476 * (float)local_548._0_4_;
    fVar401 = fVar388 * fVar434 + fVar481 * (float)local_548._4_4_;
    fVar402 = fVar398 * fVar436 + fVar476 * (float)local_548._4_4_;
    fVar497 = fVar386 * fVar326 + fVar455 * (float)local_548._0_4_;
    fVar500 = fVar461 * fVar328 + fVar472 * (float)local_548._0_4_;
    fVar501 = fVar386 * fVar434 + fVar455 * (float)local_548._4_4_;
    fVar502 = fVar461 * fVar436 + fVar472 * (float)local_548._4_4_;
    fVar423 = fVar326 * fVar450 + (float)local_548._0_4_ * fVar306;
    fVar432 = fVar328 * fVar478 + (float)local_548._0_4_ * fVar304;
    fVar435 = fVar434 * fVar450 + (float)local_548._4_4_ * fVar306;
    fVar437 = fVar436 * fVar478 + (float)local_548._4_4_ * fVar304;
    fVar466 = (local_538.upper - local_538.lower) * 0.11111111;
    fVar489 = (local_538.upper - local_538.lower) * 0.0 + local_538.lower;
    fVar494 = (local_538.upper - local_538.lower) * 0.33333334 + local_538.lower;
    fVar495 = (local_538.upper - local_538.lower) * 0.6666667 + local_538.lower;
    fVar496 = (local_538.upper - local_538.lower) * 1.0 + local_538.lower;
    fVar328 = 1.0 - fVar489;
    fVar434 = 1.0 - fVar494;
    fVar298 = 1.0 - fVar495;
    fVar299 = 1.0 - fVar496;
    fVar336 = fVar389 * fVar328 + fVar497 * fVar489;
    fVar349 = fVar389 * fVar434 + fVar497 * fVar494;
    fVar351 = fVar389 * fVar298 + fVar497 * fVar495;
    fVar352 = fVar389 * fVar299 + fVar497 * fVar496;
    fVar353 = fVar399 * fVar328 + fVar500 * fVar489;
    fVar356 = fVar399 * fVar434 + fVar500 * fVar494;
    fVar357 = fVar399 * fVar298 + fVar500 * fVar495;
    fVar358 = fVar399 * fVar299 + fVar500 * fVar496;
    fVar326 = (fVar404 * fVar328 + fVar389 * fVar489) * fVar328 + fVar489 * fVar336;
    fVar436 = (fVar404 * fVar434 + fVar389 * fVar494) * fVar434 + fVar494 * fVar349;
    fVar332 = (fVar404 * fVar298 + fVar389 * fVar495) * fVar298 + fVar495 * fVar351;
    fVar389 = (fVar404 * fVar299 + fVar389 * fVar496) * fVar299 + fVar496 * fVar352;
    fVar404 = (fVar413 * fVar328 + fVar399 * fVar489) * fVar328 + fVar489 * fVar353;
    fVar368 = (fVar413 * fVar434 + fVar399 * fVar494) * fVar434 + fVar494 * fVar356;
    fVar370 = (fVar413 * fVar298 + fVar399 * fVar495) * fVar298 + fVar495 * fVar357;
    fVar413 = (fVar413 * fVar299 + fVar399 * fVar496) * fVar299 + fVar496 * fVar358;
    fVar336 = fVar336 * fVar328 + (fVar497 * fVar328 + fVar423 * fVar489) * fVar489;
    fVar349 = fVar349 * fVar434 + (fVar497 * fVar434 + fVar423 * fVar494) * fVar494;
    fVar399 = fVar351 * fVar298 + (fVar497 * fVar298 + fVar423 * fVar495) * fVar495;
    fVar352 = fVar352 * fVar299 + (fVar497 * fVar299 + fVar423 * fVar496) * fVar496;
    fVar353 = fVar353 * fVar328 + (fVar500 * fVar328 + fVar432 * fVar489) * fVar489;
    fVar356 = fVar356 * fVar434 + (fVar500 * fVar434 + fVar432 * fVar494) * fVar494;
    fVar357 = fVar357 * fVar298 + (fVar500 * fVar298 + fVar432 * fVar495) * fVar495;
    fVar358 = fVar358 * fVar299 + (fVar500 * fVar299 + fVar432 * fVar496) * fVar496;
    local_388 = fVar328 * fVar326 + fVar489 * fVar336;
    fStack_384 = fVar434 * fVar436 + fVar494 * fVar349;
    fStack_380 = fVar298 * fVar332 + fVar495 * fVar399;
    fStack_37c = fVar299 * fVar389 + fVar496 * fVar352;
    fVar442 = fVar328 * fVar404 + fVar489 * fVar353;
    fVar452 = fVar434 * fVar368 + fVar494 * fVar356;
    fVar456 = fVar298 * fVar370 + fVar495 * fVar357;
    fVar459 = fVar299 * fVar413 + fVar496 * fVar358;
    fVar351 = (fVar349 - fVar436) * 3.0 * fVar466;
    fVar399 = (fVar399 - fVar332) * 3.0 * fVar466;
    fVar389 = (fVar352 - fVar389) * 3.0 * fVar466;
    fVar352 = (fVar356 - fVar368) * 3.0 * fVar466;
    fVar356 = (fVar357 - fVar370) * 3.0 * fVar466;
    fVar357 = (fVar358 - fVar413) * 3.0 * fVar466;
    local_358._4_4_ = fStack_380;
    local_358._0_4_ = fStack_384;
    local_358._8_4_ = fStack_37c;
    local_358._12_4_ = 0;
    local_368 = local_388 + (fVar336 - fVar326) * 3.0 * fVar466;
    fStack_364 = fStack_384 + fVar351;
    fStack_360 = fStack_380 + fVar399;
    fStack_35c = fStack_37c + fVar389;
    fVar326 = fVar442 + (fVar353 - fVar404) * 3.0 * fVar466;
    fVar436 = fVar452 + fVar352;
    fVar332 = fVar456 + fVar356;
    fVar349 = fVar459 + fVar357;
    local_378._0_4_ = fStack_384 - fVar351;
    local_378._4_4_ = fStack_380 - fVar399;
    local_378._8_4_ = fStack_37c - fVar389;
    local_378._12_4_ = 0;
    auVar210._0_4_ = fVar452 - fVar352;
    auVar210._4_4_ = fVar456 - fVar356;
    auVar210._8_4_ = fVar459 - fVar357;
    auVar210._12_4_ = 0;
    fVar399 = fVar401 * fVar328 + fVar501 * fVar489;
    fVar352 = fVar401 * fVar434 + fVar501 * fVar494;
    fVar353 = fVar401 * fVar298 + fVar501 * fVar495;
    fVar356 = fVar401 * fVar299 + fVar501 * fVar496;
    fVar357 = fVar402 * fVar328 + fVar502 * fVar489;
    fVar358 = fVar402 * fVar434 + fVar502 * fVar494;
    fVar404 = fVar402 * fVar298 + fVar502 * fVar495;
    fVar368 = fVar402 * fVar299 + fVar502 * fVar496;
    fVar336 = (fVar416 * fVar328 + fVar401 * fVar489) * fVar328 + fVar489 * fVar399;
    fVar389 = (fVar416 * fVar434 + fVar401 * fVar494) * fVar434 + fVar494 * fVar352;
    fVar351 = (fVar416 * fVar298 + fVar401 * fVar495) * fVar298 + fVar495 * fVar353;
    fVar370 = (fVar416 * fVar299 + fVar401 * fVar496) * fVar299 + fVar496 * fVar356;
    fVar497 = (fVar418 * fVar328 + fVar402 * fVar489) * fVar328 + fVar489 * fVar357;
    fVar500 = (fVar418 * fVar434 + fVar402 * fVar494) * fVar434 + fVar494 * fVar358;
    fVar417 = (fVar418 * fVar298 + fVar402 * fVar495) * fVar298 + fVar495 * fVar404;
    fVar419 = (fVar418 * fVar299 + fVar402 * fVar496) * fVar299 + fVar496 * fVar368;
    fVar413 = fVar399 * fVar328 + (fVar501 * fVar328 + fVar435 * fVar489) * fVar489;
    fVar401 = fVar352 * fVar434 + (fVar501 * fVar434 + fVar435 * fVar494) * fVar494;
    fVar402 = fVar353 * fVar298 + (fVar501 * fVar298 + fVar435 * fVar495) * fVar495;
    fVar416 = fVar356 * fVar299 + (fVar501 * fVar299 + fVar435 * fVar496) * fVar496;
    fVar432 = fVar357 * fVar328 + (fVar502 * fVar328 + fVar437 * fVar489) * fVar489;
    fVar418 = fVar358 * fVar434 + (fVar502 * fVar434 + fVar437 * fVar494) * fVar494;
    fVar423 = fVar404 * fVar298 + (fVar502 * fVar298 + fVar437 * fVar495) * fVar495;
    fVar435 = fVar368 * fVar299 + (fVar502 * fVar299 + fVar437 * fVar496) * fVar496;
    fVar357 = fVar328 * fVar336 + fVar489 * fVar413;
    fVar358 = fVar434 * fVar389 + fVar494 * fVar401;
    fVar404 = fVar298 * fVar351 + fVar495 * fVar402;
    fVar368 = fVar299 * fVar370 + fVar496 * fVar416;
    fVar399 = fVar328 * fVar497 + fVar489 * fVar432;
    fVar352 = fVar434 * fVar500 + fVar494 * fVar418;
    fVar353 = fVar298 * fVar417 + fVar495 * fVar423;
    fVar356 = fVar299 * fVar419 + fVar496 * fVar435;
    fVar328 = (fVar401 - fVar389) * 3.0 * fVar466;
    fVar298 = (fVar402 - fVar351) * 3.0 * fVar466;
    fVar389 = (fVar416 - fVar370) * 3.0 * fVar466;
    fVar416 = (fVar418 - fVar500) * 3.0 * fVar466;
    fVar418 = (fVar423 - fVar417) * 3.0 * fVar466;
    fVar423 = (fVar435 - fVar419) * 3.0 * fVar466;
    fVar417 = fVar357 + (fVar413 - fVar336) * 3.0 * fVar466;
    fVar419 = fVar358 + fVar328;
    fVar437 = fVar404 + fVar298;
    fVar489 = fVar368 + fVar389;
    fVar432 = fVar399 + (fVar432 - fVar497) * 3.0 * fVar466;
    fVar435 = fVar352 + fVar416;
    fVar497 = fVar353 + fVar418;
    fVar500 = fVar356 + fVar423;
    fVar328 = fVar358 - fVar328;
    fVar298 = fVar404 - fVar298;
    fVar389 = fVar368 - fVar389;
    fVar416 = fVar352 - fVar416;
    fVar418 = fVar353 - fVar418;
    fVar423 = fVar356 - fVar423;
    fVar434 = (fVar358 - fStack_384) + (fVar357 - local_388);
    fVar299 = (fVar404 - fStack_380) + (fVar358 - fStack_384);
    fVar336 = (fVar368 - fStack_37c) + (fVar404 - fStack_380);
    fVar351 = (fVar368 - fStack_37c) + 0.0;
    fVar370 = (fVar352 - fVar452) + (fVar399 - fVar442);
    fVar413 = (fVar353 - fVar456) + (fVar352 - fVar452);
    fVar401 = (fVar356 - fVar459) + (fVar353 - fVar456);
    fVar402 = (fVar356 - fVar459) + 0.0;
    auVar360._0_8_ =
         CONCAT44(fVar452 * fVar299 - fStack_384 * fVar413,fVar442 * fVar434 - local_388 * fVar370);
    auVar360._8_4_ = fVar456 * fVar336 - fStack_380 * fVar401;
    auVar360._12_4_ = fVar459 * fVar351 - fStack_37c * fVar402;
    auVar315._0_4_ = fVar326 * fVar434 - local_368 * fVar370;
    auVar315._4_4_ = fVar436 * fVar299 - fStack_364 * fVar413;
    auVar315._8_4_ = fVar332 * fVar336 - fStack_360 * fVar401;
    auVar315._12_4_ = fVar349 * fVar351 - fStack_35c * fVar402;
    auVar338._0_8_ =
         CONCAT44(auVar210._4_4_ * fVar299 - fVar413 * local_378._4_4_,
                  auVar210._0_4_ * fVar434 - fVar370 * local_378._0_4_);
    auVar338._8_4_ = auVar210._8_4_ * fVar336 - fVar401 * local_378._8_4_;
    auVar338._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
    auVar447._0_4_ = fVar434 * fVar452 - fVar370 * fStack_384;
    auVar447._4_4_ = fVar299 * fVar456 - fVar413 * fStack_380;
    auVar447._8_4_ = fVar336 * fVar459 - fVar401 * fStack_37c;
    auVar447._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
    auVar391._0_8_ =
         CONCAT44(fVar352 * fVar299 - fVar358 * fVar413,fVar399 * fVar434 - fVar357 * fVar370);
    auVar391._8_4_ = fVar353 * fVar336 - fVar404 * fVar401;
    auVar391._12_4_ = fVar356 * fVar351 - fVar368 * fVar402;
    auVar468._0_4_ = fVar432 * fVar434 - fVar417 * fVar370;
    auVar468._4_4_ = fVar435 * fVar299 - fVar419 * fVar413;
    auVar468._8_4_ = fVar497 * fVar336 - fVar437 * fVar401;
    auVar468._12_4_ = fVar500 * fVar351 - fVar489 * fVar402;
    auVar378._0_8_ =
         CONCAT44(fVar418 * fVar299 - fVar413 * fVar298,fVar416 * fVar434 - fVar370 * fVar328);
    auVar378._8_4_ = fVar423 * fVar336 - fVar401 * fVar389;
    auVar378._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
    auVar220._0_4_ = fVar434 * fVar352 - fVar370 * fVar358;
    auVar220._4_4_ = fVar299 * fVar353 - fVar413 * fVar404;
    auVar220._8_4_ = fVar336 * fVar356 - fVar401 * fVar368;
    auVar220._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
    auVar248._8_4_ = auVar360._8_4_;
    auVar248._0_8_ = auVar360._0_8_;
    auVar248._12_4_ = auVar360._12_4_;
    auVar301 = minps(auVar248,auVar315);
    auVar246 = maxps(auVar360,auVar315);
    auVar316._8_4_ = auVar338._8_4_;
    auVar316._0_8_ = auVar338._0_8_;
    auVar316._12_4_ = auVar338._12_4_;
    auVar446 = minps(auVar316,auVar447);
    auVar301 = minps(auVar301,auVar446);
    auVar446 = maxps(auVar338,auVar447);
    auVar287 = maxps(auVar246,auVar446);
    auVar317._8_4_ = auVar391._8_4_;
    auVar317._0_8_ = auVar391._0_8_;
    auVar317._12_4_ = auVar391._12_4_;
    auVar446 = minps(auVar317,auVar468);
    auVar392 = maxps(auVar391,auVar468);
    auVar339._8_4_ = auVar378._8_4_;
    auVar339._0_8_ = auVar378._0_8_;
    auVar339._12_4_ = auVar378._12_4_;
    auVar246 = minps(auVar339,auVar220);
    auVar446 = minps(auVar446,auVar246);
    auVar301 = minps(auVar301,auVar446);
    auVar446 = maxps(auVar378,auVar220);
    auVar446 = maxps(auVar392,auVar446);
    auVar446 = maxps(auVar287,auVar446);
    bVar143 = auVar301._4_4_ <= fVar262;
    bVar36 = auVar301._8_4_ <= fVar262;
    auVar107._4_4_ = -(uint)bVar36;
    auVar107._0_4_ = -(uint)bVar143;
    auVar107._8_4_ = -(uint)(auVar301._12_4_ <= fVar262);
    auVar107._12_4_ = 0;
    auVar252 = auVar107 << 0x20;
    bVar117 = (-fVar262 <= auVar446._0_4_ && auVar301._0_4_ <= fVar262) && bVar38;
    auVar361._0_4_ = -(uint)bVar117;
    bVar118 = (-fVar262 <= auVar446._4_4_ && bVar143) && bVar39;
    auVar361._4_4_ = -(uint)bVar118;
    bVar143 = (-fVar262 <= auVar446._8_4_ && bVar36) && bVar40;
    auVar361._8_4_ = -(uint)bVar143;
    auVar361._12_4_ = 0;
    uVar145 = movmskps((int)uVar147,auVar361);
    uVar147 = (ulong)uVar145;
    if (uVar145 != 0) {
      fVar434 = (fVar358 - fVar357) + (fStack_384 - local_388);
      fVar299 = (fVar404 - fVar358) + (fStack_380 - fStack_384);
      fVar336 = (fVar368 - fVar404) + (fStack_37c - fStack_380);
      fVar351 = (0.0 - fVar368) + (0.0 - fStack_37c);
      fVar370 = (fVar352 - fVar399) + (fVar452 - fVar442);
      fVar413 = (fVar353 - fVar352) + (fVar456 - fVar452);
      fVar401 = (fVar356 - fVar353) + (fVar459 - fVar456);
      fVar402 = (0.0 - fVar356) + (0.0 - fVar459);
      auVar491._0_8_ =
           CONCAT44(fVar452 * fVar299 - fStack_384 * fVar413,fVar442 * fVar434 - local_388 * fVar370
                   );
      auVar491._8_4_ = fVar456 * fVar336 - fStack_380 * fVar401;
      auVar491._12_4_ = fVar459 * fVar351 - fStack_37c * fVar402;
      auVar318._0_4_ = fVar326 * fVar434 - local_368 * fVar370;
      auVar318._4_4_ = fVar436 * fVar299 - fStack_364 * fVar413;
      auVar318._8_4_ = fVar332 * fVar336 - fStack_360 * fVar401;
      auVar318._12_4_ = fVar349 * fVar351 - fStack_35c * fVar402;
      auVar379._0_8_ =
           CONCAT44(auVar210._4_4_ * fVar299 - local_378._4_4_ * fVar413,
                    auVar210._0_4_ * fVar434 - local_378._0_4_ * fVar370);
      auVar379._8_4_ = auVar210._8_4_ * fVar336 - local_378._8_4_ * fVar401;
      auVar379._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
      auVar340._0_4_ = fVar452 * fVar434 - fStack_384 * fVar370;
      auVar340._4_4_ = fVar456 * fVar299 - fStack_380 * fVar413;
      auVar340._8_4_ = fVar459 * fVar336 - fStack_37c * fVar401;
      auVar340._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
      auVar292._0_8_ =
           CONCAT44(fVar352 * fVar299 - fVar358 * fVar413,fVar399 * fVar434 - fVar357 * fVar370);
      auVar292._8_4_ = fVar353 * fVar336 - fVar404 * fVar401;
      auVar292._12_4_ = fVar356 * fVar351 - fVar368 * fVar402;
      auVar406._0_4_ = fVar432 * fVar434 - fVar417 * fVar370;
      auVar406._4_4_ = fVar435 * fVar299 - fVar419 * fVar413;
      auVar406._8_4_ = fVar497 * fVar336 - fVar437 * fVar401;
      auVar406._12_4_ = fVar500 * fVar351 - fVar489 * fVar402;
      auVar448._0_8_ =
           CONCAT44(fVar418 * fVar299 - fVar298 * fVar413,fVar416 * fVar434 - fVar328 * fVar370);
      auVar448._8_4_ = fVar423 * fVar336 - fVar389 * fVar401;
      auVar448._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
      auVar220._0_4_ = fVar434 * fVar352 - fVar370 * fVar358;
      auVar220._4_4_ = fVar299 * fVar353 - fVar413 * fVar404;
      auVar220._8_4_ = fVar336 * fVar356 - fVar401 * fVar368;
      auVar220._12_4_ = fVar351 * 0.0 - fVar402 * 0.0;
      auVar249._8_4_ = auVar491._8_4_;
      auVar249._0_8_ = auVar491._0_8_;
      auVar249._12_4_ = auVar491._12_4_;
      auVar301 = minps(auVar249,auVar318);
      auVar246 = maxps(auVar491,auVar318);
      auVar319._8_4_ = auVar379._8_4_;
      auVar319._0_8_ = auVar379._0_8_;
      auVar319._12_4_ = auVar379._12_4_;
      auVar446 = minps(auVar319,auVar340);
      auVar301 = minps(auVar301,auVar446);
      auVar446 = maxps(auVar379,auVar340);
      auVar392 = maxps(auVar246,auVar446);
      auVar320._8_4_ = auVar292._8_4_;
      auVar320._0_8_ = auVar292._0_8_;
      auVar320._12_4_ = auVar292._12_4_;
      auVar246 = minps(auVar320,auVar406);
      auVar446 = maxps(auVar292,auVar406);
      auVar341._8_4_ = auVar448._8_4_;
      auVar341._0_8_ = auVar448._0_8_;
      auVar341._12_4_ = auVar448._12_4_;
      auVar287 = minps(auVar341,auVar220);
      auVar246 = minps(auVar246,auVar287);
      auVar301 = minps(auVar301,auVar246);
      auVar246 = maxps(auVar448,auVar220);
      auVar446 = maxps(auVar446,auVar246);
      auVar446 = maxps(auVar392,auVar446);
      bVar36 = auVar301._4_4_ <= fVar262;
      bVar37 = auVar301._8_4_ <= fVar262;
      auVar108._4_4_ = -(uint)bVar37;
      auVar108._0_4_ = -(uint)bVar36;
      auVar108._8_4_ = -(uint)(auVar301._12_4_ <= fVar262);
      auVar108._12_4_ = 0;
      auVar252 = auVar108 << 0x20;
      auVar492._0_4_ = -(uint)((-fVar262 <= auVar446._0_4_ && auVar301._0_4_ <= fVar262) && bVar117)
      ;
      auVar492._4_4_ = -(uint)((-fVar262 <= auVar446._4_4_ && bVar36) && bVar118);
      auVar492._8_4_ = -(uint)((-fVar262 <= auVar446._8_4_ && bVar37) && bVar143);
      auVar492._12_4_ = 0;
      uVar145 = movmskps(uVar145,auVar492);
      uVar147 = (ulong)uVar145;
      if (uVar145 != 0) {
        uVar147 = (ulong)(byte)uVar145;
        mask_stack[uVar157] = uVar145 & 0xff;
        cu_stack[uVar157] = local_538;
        cv_stack[uVar157].lower = (float)local_548._0_4_;
        cv_stack[uVar157].upper = (float)local_548._4_4_;
        uVar157 = uVar157 + 1;
        auVar220 = _local_548;
      }
    }
LAB_003d63f6:
    _local_528 = auVar210;
    auVar301 = _local_528;
    if (uVar157 == 0) {
      if (bVar150 != 0) goto LAB_003d7578;
      fVar227 = *(float *)(ray + k * 4 + 0x80);
      auVar260._4_4_ = -(uint)(fVar159 <= fVar227);
      auVar260._0_4_ = -(uint)(fVar477 <= fVar227);
      auVar260._8_4_ = -(uint)(fVar160 <= fVar227);
      auVar260._12_4_ = -(uint)(fVar222 <= fVar227);
      uVar155 = movmskps((int)uVar147,auVar260);
      uVar154 = uVar154 & uVar154 + 0xf & uVar155;
      goto LAB_003d4f3d;
    }
    uVar145 = uVar157 - 1;
    uVar147 = (ulong)uVar145;
    uVar153 = mask_stack[uVar147];
    local_548._0_4_ = cv_stack[uVar147].lower;
    local_548._4_4_ = cv_stack[uVar147].upper;
    fStack_540 = 0.0;
    fStack_53c = 0.0;
    uVar19 = 0;
    if (uVar153 != 0) {
      for (; (uVar153 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
      }
    }
    uVar153 = uVar153 - 1 & uVar153;
    mask_stack[uVar147] = uVar153;
    if (uVar153 == 0) {
      uVar157 = uVar145;
    }
    fVar434 = (float)(uVar19 + 1) * 0.33333334;
    fVar436 = auVar220._4_4_ * 0.0;
    fVar298 = auVar252._4_4_ * 0.0;
    fVar326 = cu_stack[uVar147].lower;
    fVar328 = cu_stack[uVar147].upper;
    local_538.lower =
         fVar326 * (1.0 - (float)uVar19 * 0.33333334) + fVar328 * (float)uVar19 * 0.33333334;
    local_538.upper = fVar326 * (1.0 - fVar434) + fVar328 * fVar434;
    fVar434 = fVar326 * (0.0 - fVar436) + fVar328 * fVar436;
    fVar328 = fVar326 * (0.0 - fVar298) + fVar328 * fVar298;
    fVar326 = local_538.upper - local_538.lower;
    if (fVar326 < 0.16666667) {
      fVar336 = 1.0 - (float)local_548._0_4_;
      fVar351 = 1.0 - (float)local_548._0_4_;
      fVar353 = 1.0 - (float)local_548._4_4_;
      fVar356 = 1.0 - (float)local_548._4_4_;
      fVar389 = fVar412 * fVar336 + fVar480 * (float)local_548._0_4_;
      fVar349 = fVar415 * fVar351 + fVar307 * (float)local_548._0_4_;
      fVar399 = fVar412 * fVar353 + fVar480 * (float)local_548._4_4_;
      fVar352 = fVar415 * fVar356 + fVar307 * (float)local_548._4_4_;
      fVar436 = fVar388 * fVar336 + fVar481 * (float)local_548._0_4_;
      fVar298 = fVar398 * fVar351 + fVar476 * (float)local_548._0_4_;
      fVar299 = fVar388 * fVar353 + fVar481 * (float)local_548._4_4_;
      fVar332 = fVar398 * fVar356 + fVar476 * (float)local_548._4_4_;
      fVar416 = fVar386 * fVar336 + fVar455 * (float)local_548._0_4_;
      fVar423 = fVar461 * fVar351 + fVar472 * (float)local_548._0_4_;
      fVar435 = fVar386 * fVar353 + fVar455 * (float)local_548._4_4_;
      fVar500 = fVar461 * fVar356 + fVar472 * (float)local_548._4_4_;
      fVar370 = (fVar336 * fVar450 + (float)local_548._0_4_ * fVar306) - fVar416;
      fVar413 = (fVar351 * fVar478 + (float)local_548._0_4_ * fVar304) - fVar423;
      fVar401 = (fVar353 * fVar450 + (float)local_548._4_4_ * fVar306) - fVar435;
      fVar402 = (fVar356 * fVar478 + (float)local_548._4_4_ * fVar304) - fVar500;
      fVar336 = local_538.lower * (fVar416 - fVar436) + fVar436;
      fVar351 = local_538.lower * (fVar423 - fVar298) + fVar298;
      fVar353 = local_538.lower * (fVar435 - fVar299) + fVar299;
      fVar356 = local_538.lower * (fVar500 - fVar332) + fVar332;
      fVar418 = (fVar416 - fVar436) * local_538.upper + fVar436;
      fVar432 = (fVar423 - fVar298) * local_538.upper + fVar298;
      fVar497 = (fVar435 - fVar299) * local_538.upper + fVar299;
      fVar417 = (fVar500 - fVar332) * local_538.upper + fVar332;
      fVar357 = local_538.lower * (fVar436 - fVar389) + fVar389;
      fVar358 = local_538.lower * (fVar298 - fVar349) + fVar349;
      fVar404 = local_538.lower * (fVar299 - fVar399) + fVar399;
      fVar368 = local_538.lower * (fVar332 - fVar352) + fVar352;
      fVar357 = (fVar336 - fVar357) * local_538.lower + fVar357;
      fVar358 = (fVar351 - fVar358) * local_538.lower + fVar358;
      fVar404 = (fVar353 - fVar404) * local_538.lower + fVar404;
      fVar368 = (fVar356 - fVar368) * local_538.lower + fVar368;
      fVar336 = (((local_538.lower * fVar370 + fVar416) - fVar336) * local_538.lower + fVar336) -
                fVar357;
      fVar351 = (((local_538.lower * fVar413 + fVar423) - fVar351) * local_538.lower + fVar351) -
                fVar358;
      fVar353 = (((local_538.lower * fVar401 + fVar435) - fVar353) * local_538.lower + fVar353) -
                fVar404;
      fVar356 = (((local_538.lower * fVar402 + fVar500) - fVar356) * local_538.lower + fVar356) -
                fVar368;
      fVar357 = local_538.lower * fVar336 + fVar357;
      fVar358 = local_538.lower * fVar351 + fVar358;
      fVar404 = local_538.lower * fVar353 + fVar404;
      fVar368 = local_538.lower * fVar356 + fVar368;
      fVar389 = (fVar436 - fVar389) * local_538.upper + fVar389;
      fVar349 = (fVar298 - fVar349) * local_538.upper + fVar349;
      fVar399 = (fVar299 - fVar399) * local_538.upper + fVar399;
      fVar352 = (fVar332 - fVar352) * local_538.upper + fVar352;
      fVar389 = (fVar418 - fVar389) * local_538.upper + fVar389;
      fVar349 = (fVar432 - fVar349) * local_538.upper + fVar349;
      fVar399 = (fVar497 - fVar399) * local_538.upper + fVar399;
      fVar352 = (fVar417 - fVar352) * local_538.upper + fVar352;
      fVar298 = (((fVar370 * local_538.upper + fVar416) - fVar418) * local_538.upper + fVar418) -
                fVar389;
      fVar299 = (((fVar413 * local_538.upper + fVar423) - fVar432) * local_538.upper + fVar432) -
                fVar349;
      fVar332 = (((fVar401 * local_538.upper + fVar435) - fVar497) * local_538.upper + fVar497) -
                fVar399;
      fVar432 = (((fVar402 * local_538.upper + fVar500) - fVar417) * local_538.upper + fVar417) -
                fVar352;
      fVar389 = local_538.upper * fVar298 + fVar389;
      fVar349 = local_538.upper * fVar299 + fVar349;
      fVar399 = local_538.upper * fVar332 + fVar399;
      fVar352 = local_538.upper * fVar432 + fVar352;
      fVar436 = fVar326 * 0.33333334;
      fVar370 = fVar336 * (float)DAT_01f4afa0 * fVar436 + fVar357;
      fVar413 = fVar351 * DAT_01f4afa0._4_4_ * fVar436 + fVar358;
      fVar401 = fVar353 * DAT_01f4afa0._8_4_ * fVar436 + fVar404;
      fVar402 = fVar356 * DAT_01f4afa0._12_4_ * fVar436 + fVar368;
      fVar416 = fVar389 - fVar436 * fVar298 * (float)DAT_01f4afa0;
      fVar418 = fVar349 - fVar436 * fVar299 * DAT_01f4afa0._4_4_;
      fVar423 = fVar399 - fVar436 * fVar332 * DAT_01f4afa0._8_4_;
      fVar432 = fVar352 - fVar436 * fVar432 * DAT_01f4afa0._12_4_;
      auVar43._4_8_ = DAT_01f4afa0._8_8_;
      auVar43._0_4_ = fVar349;
      auVar380._0_8_ = auVar43._0_8_ << 0x20;
      auVar380._8_4_ = fVar399;
      auVar380._12_4_ = fVar352;
      fVar336 = (fVar399 - fVar389) + (fVar404 - fVar357);
      fVar351 = (fVar352 - fVar349) + (fVar368 - fVar358);
      auVar393._0_4_ = fVar418 * fVar351;
      auVar393._4_4_ = fVar418 * fVar351;
      auVar393._8_4_ = fVar432 * fVar351;
      auVar393._12_4_ = fVar432 * fVar351;
      fVar436 = fVar357 * fVar336 + fVar358 * fVar351;
      fVar298 = fVar404 * fVar336 + fVar368 * fVar351;
      fVar353 = fVar370 * fVar336 + fVar413 * fVar351;
      fVar356 = fVar401 * fVar336 + fVar402 * fVar351;
      fVar435 = fVar416 * fVar336 + auVar393._0_4_;
      auVar362._0_8_ = CONCAT44(fVar418 * fVar336 + auVar393._4_4_,fVar435);
      auVar362._8_4_ = fVar423 * fVar336 + auVar393._8_4_;
      auVar362._12_4_ = fVar432 * fVar336 + auVar393._12_4_;
      fVar332 = fVar336 * fVar389 + fVar351 * fVar349;
      fVar497 = fVar336 * fVar399 + fVar351 * fVar352;
      auVar44._4_8_ = auVar393._8_8_;
      auVar44._0_4_ = fVar413 * fVar336 + fVar413 * fVar351;
      auVar394._0_8_ = auVar44._0_8_ << 0x20;
      auVar394._8_4_ = fVar356;
      auVar394._12_4_ = fVar402 * fVar336 + fVar402 * fVar351;
      fVar299 = fVar353;
      if (fVar353 <= fVar436) {
        fVar299 = fVar436;
        fVar436 = fVar353;
      }
      auVar395._8_8_ = auVar394._8_8_;
      auVar395._0_8_ = auVar395._8_8_;
      auVar211._8_4_ = auVar362._8_4_;
      auVar211._0_8_ = auVar362._0_8_;
      auVar211._12_4_ = auVar362._12_4_;
      if (fVar332 <= fVar435) {
        auVar211._0_4_ = fVar332;
      }
      if (auVar211._0_4_ <= fVar436) {
        fVar436 = auVar211._0_4_;
      }
      auVar45._4_8_ = auVar211._8_8_;
      auVar45._0_4_ = fVar336 * fVar349 + fVar351 * fVar349;
      auVar212._0_8_ = auVar45._0_8_ << 0x20;
      auVar212._8_4_ = fVar497;
      auVar212._12_4_ = fVar336 * fVar352 + fVar351 * fVar352;
      if (fVar332 <= fVar435) {
        fVar332 = fVar435;
      }
      auVar220._8_8_ = auVar212._8_8_;
      auVar220._0_8_ = auVar220._8_8_;
      if (fVar332 <= fVar299) {
        fVar332 = fVar299;
      }
      if (fVar356 <= fVar298) {
        auVar395._0_4_ = fVar298;
        fVar298 = fVar356;
      }
      auVar250._8_4_ = auVar362._8_4_;
      auVar250._0_8_ = auVar362._8_8_;
      auVar250._12_4_ = auVar362._12_4_;
      if (fVar497 <= auVar362._8_4_) {
        auVar250._0_4_ = fVar497;
      }
      if (auVar250._0_4_ <= fVar298) {
        fVar298 = auVar250._0_4_;
      }
      if (fVar497 <= auVar362._8_4_) {
        auVar220._0_4_ = auVar362._8_4_;
      }
      if (auVar220._0_4_ <= auVar395._0_4_) {
        auVar220._0_4_ = auVar395._0_4_;
      }
      uVar46 = (undefined3)(uVar145 >> 8);
      uVar147 = (ulong)CONCAT31(uVar46,3 < uVar157);
      fVar299 = auVar220._0_4_;
      if ((0.0001 <= fVar436) || (fVar299 <= -0.0001)) break;
      goto LAB_003d6756;
    }
  } while( true );
  auVar252._0_12_ = ZEXT812(0x38d1b717);
  auVar252._12_4_ = 0;
  if ((fVar298 < 0.0001 && -0.0001 < fVar332) ||
     ((fVar436 < 0.0001 && -0.0001 < fVar332 ||
      (auVar210 = _local_528, fVar298 < 0.0001 && -0.0001 < fVar299)))) {
LAB_003d6756:
    _local_528 = auVar380._8_8_;
    auVar210 = _local_528;
    bVar143 = 3 < uVar157 || fVar326 < 0.001;
    uVar147 = (ulong)CONCAT31(uVar46,bVar143);
    fVar351 = (float)(~-(uint)(fVar436 < 0.0) & 0x3f800000 | -(uint)(fVar436 < 0.0) & 0xbf800000);
    fVar353 = (float)(~-(uint)(fVar332 < 0.0) & 0x3f800000 | -(uint)(fVar332 < 0.0) & 0xbf800000);
    fVar336 = 0.0;
    if ((fVar351 == fVar353) && (!NAN(fVar351) && !NAN(fVar353))) {
      fVar336 = INFINITY;
    }
    fVar356 = 0.0;
    if ((fVar351 == fVar353) && (!NAN(fVar351) && !NAN(fVar353))) {
      fVar356 = -INFINITY;
    }
    fVar435 = (float)(~-(uint)(fVar298 < 0.0) & 0x3f800000 | -(uint)(fVar298 < 0.0) & 0xbf800000);
    if ((fVar351 != fVar435) || (fVar497 = fVar356, NAN(fVar351) || NAN(fVar435))) {
      if ((fVar298 != fVar436) || (NAN(fVar298) || NAN(fVar436))) {
        fVar298 = -fVar436 / (fVar298 - fVar436);
        fVar298 = (1.0 - fVar298) * 0.0 + fVar298;
        fVar497 = fVar298;
      }
      else {
        fVar298 = 0.0;
        if ((fVar436 != 0.0) || (fVar497 = 1.0, NAN(fVar436))) {
          fVar298 = INFINITY;
          fVar497 = -INFINITY;
        }
      }
      if (fVar298 <= fVar336) {
        fVar336 = fVar298;
      }
      if (fVar497 <= fVar356) {
        fVar497 = fVar356;
      }
    }
    fVar436 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar299 < 0.0) * 4);
    if ((fVar353 != fVar436) || (fVar298 = fVar497, NAN(fVar353) || NAN(fVar436))) {
      if ((fVar299 != fVar332) || (NAN(fVar299) || NAN(fVar332))) {
        fVar351 = -fVar332 / (fVar299 - fVar332);
        fVar351 = (1.0 - fVar351) * 0.0 + fVar351;
        fVar298 = fVar351;
      }
      else {
        fVar351 = 0.0;
        if ((fVar332 != 0.0) || (fVar298 = 1.0, NAN(fVar332))) {
          fVar351 = INFINITY;
          fVar298 = -INFINITY;
        }
      }
      if (fVar351 <= fVar336) {
        fVar336 = fVar351;
      }
      if (fVar298 <= fVar497) {
        fVar298 = fVar497;
      }
    }
    if ((fVar435 != fVar436) || (NAN(fVar435) || NAN(fVar436))) {
      fVar336 = (float)(~-(uint)(fVar336 < 1.0) & 0x3f800000 |
                       (uint)fVar336 & -(uint)(fVar336 < 1.0));
      fVar298 = (float)(~-(uint)(fVar298 < 1.0) & (uint)fVar298 |
                       -(uint)(fVar298 < 1.0) & 0x3f800000);
    }
    auVar251._0_8_ =
         CONCAT44(~-(uint)(fVar298 < 1.0),~-(uint)(fVar336 < 0.0) & (uint)fVar336) &
         0x3f800000ffffffff;
    auVar251._8_8_ = 0;
    auVar252 = auVar251 | ZEXT416((uint)fVar298 & -(uint)(fVar298 < 1.0)) << 0x20;
    fVar436 = auVar252._4_4_;
    auVar220._4_4_ = fVar436;
    auVar220._0_4_ = fVar436;
    auVar220._8_4_ = fVar436;
    auVar220._12_4_ = fVar436;
    fStack_520 = auVar301._8_4_;
    fStack_51c = auVar301._12_4_;
    if (auVar252._0_4_ <= fVar436) {
      fVar298 = auVar252._0_4_ + -0.1;
      fVar332 = auVar252._8_4_ + 0.0;
      fVar336 = auVar252._12_4_ + 0.0;
      uVar145 = -(uint)(fVar436 + 0.1 < 1.0);
      fVar298 = (float)(~-(uint)(fVar298 < 0.0) & (uint)fVar298);
      fVar436 = (float)(~uVar145 & 0x3f800000 | (uint)(fVar436 + 0.1) & uVar145);
      fVar435 = 1.0 - fVar298;
      fVar497 = 1.0 - fVar298;
      fVar500 = 1.0 - fVar436;
      fVar417 = 1.0 - fVar436;
      fVar351 = fVar357 * fVar435 + fVar404 * fVar298;
      fVar353 = fVar358 * fVar497 + fVar368 * fVar298;
      fVar356 = fVar357 * fVar500 + fVar404 * fVar436;
      fVar357 = fVar358 * fVar417 + fVar368 * fVar436;
      fVar358 = fVar370 * fVar435 + fVar401 * fVar298;
      fVar404 = fVar413 * fVar497 + fVar402 * fVar298;
      fVar368 = fVar370 * fVar500 + fVar401 * fVar436;
      fVar370 = fVar413 * fVar417 + fVar402 * fVar436;
      fVar413 = fVar416 * fVar435 + fVar423 * fVar298;
      fVar401 = fVar418 * fVar497 + fVar432 * fVar298;
      fVar402 = fVar416 * fVar500 + fVar423 * fVar436;
      fVar416 = fVar418 * fVar417 + fVar432 * fVar436;
      fVar399 = fVar435 * fVar389 + fVar399 * fVar298;
      fVar352 = fVar497 * fVar349 + fVar352 * fVar298;
      fVar418 = fVar500 * fVar389 + fStack_520 * fVar436;
      fVar423 = fVar417 * fVar349 + fStack_51c * fVar436;
      fVar389 = (float)local_548._4_4_ * fVar332;
      fVar349 = (float)local_548._4_4_ * fVar336;
      fVar432 = (float)local_548._0_4_ * (1.0 - fVar436);
      fStack_540 = (float)local_548._0_4_ * (0.0 - fVar332);
      fStack_53c = (float)local_548._0_4_ * (0.0 - fVar336);
      local_548._0_4_ = (float)local_548._0_4_ * (1.0 - fVar298) + (float)local_548._4_4_ * fVar298;
      local_548._4_4_ = fVar432 + (float)local_548._4_4_ * fVar436;
      fStack_540 = fStack_540 + fVar389;
      fStack_53c = fStack_53c + fVar349;
      fVar326 = 1.0 / fVar326;
      auVar253._0_4_ = fVar418 - fVar399;
      auVar253._4_4_ = fVar423 - fVar352;
      auVar253._8_4_ = fVar418 - fVar418;
      auVar253._12_4_ = fVar423 - fVar423;
      auVar302._0_8_ = CONCAT44(fVar416 - fVar401,fVar402 - fVar413);
      auVar302._8_4_ = fVar402 - fVar402;
      auVar302._12_4_ = fVar416 - fVar416;
      auVar342._0_4_ = fVar368 - fVar358;
      auVar342._4_4_ = fVar370 - fVar404;
      auVar342._8_4_ = fVar368 - fVar368;
      auVar342._12_4_ = fVar370 - fVar370;
      auVar396._0_8_ = CONCAT44((fVar404 - fVar353) * 3.0,(fVar358 - fVar351) * 3.0);
      auVar396._8_4_ = (fVar368 - fVar356) * 3.0;
      auVar396._12_4_ = (fVar370 - fVar357) * 3.0;
      auVar321._0_8_ = CONCAT44((fVar401 - fVar404) * 3.0,(fVar413 - fVar358) * 3.0);
      auVar321._8_4_ = (fVar402 - fVar368) * 3.0;
      auVar321._12_4_ = (fVar416 - fVar370) * 3.0;
      auVar426._0_4_ = (fVar399 - fVar413) * 3.0;
      auVar426._4_4_ = (fVar352 - fVar401) * 3.0;
      auVar426._8_4_ = (fVar418 - fVar402) * 3.0;
      auVar426._12_4_ = (fVar423 - fVar416) * 3.0;
      auVar363._8_4_ = auVar321._8_4_;
      auVar363._0_8_ = auVar321._0_8_;
      auVar363._12_4_ = auVar321._12_4_;
      auVar446 = minps(auVar363,auVar426);
      auVar301 = maxps(auVar321,auVar426);
      auVar407._8_4_ = auVar396._8_4_;
      auVar407._0_8_ = auVar396._0_8_;
      auVar407._12_4_ = auVar396._12_4_;
      auVar287 = minps(auVar407,auVar446);
      auVar246 = maxps(auVar396,auVar301);
      auVar47._4_8_ = auVar301._8_8_;
      auVar47._0_4_ = auVar287._4_4_;
      auVar322._0_8_ = auVar47._0_8_ << 0x20;
      auVar322._8_4_ = auVar287._8_4_;
      auVar322._12_4_ = auVar287._12_4_;
      auVar323._8_8_ = auVar287._8_8_;
      auVar323._0_8_ = auVar322._8_8_;
      auVar48._4_8_ = auVar446._8_8_;
      auVar48._0_4_ = auVar246._4_4_;
      auVar364._0_8_ = auVar48._0_8_ << 0x20;
      auVar364._8_4_ = auVar246._8_4_;
      auVar364._12_4_ = auVar246._12_4_;
      auVar365._8_8_ = auVar246._8_8_;
      auVar365._0_8_ = auVar364._8_8_;
      auVar446 = minps(auVar287,auVar323);
      auVar301 = maxps(auVar246,auVar365);
      fVar435 = auVar446._0_4_ * fVar326;
      fVar497 = auVar446._4_4_ * fVar326;
      fVar500 = auVar446._8_4_ * fVar326;
      fVar417 = auVar446._12_4_ * fVar326;
      fVar358 = fVar326 * auVar301._0_4_;
      fVar368 = fVar326 * auVar301._4_4_;
      fVar413 = fVar326 * auVar301._8_4_;
      fVar326 = fVar326 * auVar301._12_4_;
      fVar423 = 1.0 / ((float)local_548._4_4_ - (float)local_548._0_4_);
      auVar213._0_8_ = CONCAT44(fVar357 - fVar353,fVar356 - fVar351);
      auVar213._8_4_ = fVar356 - fVar356;
      auVar213._12_4_ = fVar357 - fVar357;
      auVar381._8_4_ = auVar213._8_4_;
      auVar381._0_8_ = auVar213._0_8_;
      auVar381._12_4_ = auVar213._12_4_;
      auVar246 = minps(auVar381,auVar342);
      auVar301 = maxps(auVar213,auVar342);
      auVar293._8_4_ = auVar302._8_4_;
      auVar293._0_8_ = auVar302._0_8_;
      auVar293._12_4_ = auVar302._12_4_;
      auVar446 = minps(auVar293,auVar253);
      auVar246 = minps(auVar246,auVar446);
      auVar446 = maxps(auVar302,auVar253);
      auVar301 = maxps(auVar301,auVar446);
      fVar416 = auVar246._0_4_ * fVar423;
      fVar418 = auVar246._4_4_ * fVar423;
      fVar432 = fVar423 * auVar301._0_4_;
      fVar423 = fVar423 * auVar301._4_4_;
      stack0xfffffffffffffadc = local_548._0_4_;
      local_528._0_4_ = local_538.lower;
      fStack_520 = local_538.upper;
      fStack_51c = (float)local_548._4_4_;
      auVar366._4_4_ = local_548._4_4_;
      auVar366._0_4_ = local_538.upper;
      auVar366._8_4_ = fVar434;
      auVar366._12_4_ = fVar328;
      fVar352 = (local_538.lower + local_538.upper) * 0.5;
      fVar353 = ((float)local_548._0_4_ + (float)local_548._4_4_) * 0.5;
      fVar356 = (local_538.upper + fVar434) * 0.0;
      fVar357 = ((float)local_548._4_4_ + fVar328) * 0.0;
      p00_1.field_0.i[2] = auVar231._8_4_;
      p00_1.field_0.i[3] = auVar231._12_4_;
      fVar436 = (fVar388 - fVar412) * fVar352 + fVar412;
      fVar298 = (fVar398 - fVar415) * fVar352 + fVar415;
      fVar332 = (fVar481 - fVar480) * fVar352 + p00_1.field_0.v[2];
      fVar389 = (fVar476 - fVar307) * fVar352 + p00_1.field_0.v[3];
      fVar336 = (fVar386 - fVar388) * fVar352 + fVar388;
      fVar349 = (fVar461 - fVar398) * fVar352 + fVar398;
      fVar351 = (fVar455 - fVar481) * fVar352 + fVar481;
      fVar399 = (fVar472 - fVar476) * fVar352 + fVar476;
      fVar436 = (fVar336 - fVar436) * fVar352 + fVar436;
      fVar298 = (fVar349 - fVar298) * fVar352 + fVar298;
      fVar332 = (fVar351 - fVar332) * fVar352 + fVar332;
      fVar389 = (fVar399 - fVar389) * fVar352 + fVar389;
      fVar336 = ((((fVar450 - fVar386) * fVar352 + fVar386) - fVar336) * fVar352 + fVar336) -
                fVar436;
      fVar349 = ((((fVar478 - fVar461) * fVar352 + fVar461) - fVar349) * fVar352 + fVar349) -
                fVar298;
      fVar351 = ((((fVar306 - fVar455) * fVar352 + p02.field_0.v[2]) - fVar351) * fVar352 + fVar351)
                - fVar332;
      fVar399 = ((((fVar304 - fVar472) * fVar352 + p02.field_0.v[3]) - fVar399) * fVar352 + fVar399)
                - fVar389;
      fVar436 = fVar352 * fVar336 + fVar436;
      fVar298 = fVar352 * fVar349 + fVar298;
      fVar336 = fVar336 * 3.0;
      fVar349 = fVar349 * 3.0;
      fVar332 = (fVar352 * fVar351 + fVar332) - fVar436;
      fVar389 = (fVar352 * fVar399 + fVar389) - fVar298;
      fVar336 = (fVar351 * 3.0 - fVar336) * fVar353 + fVar336;
      fVar349 = (fVar399 * 3.0 - fVar349) * fVar353 + fVar349;
      auVar303._0_8_ = CONCAT44(fVar336,fVar332) ^ 0x80000000;
      auVar303._8_4_ = fVar336;
      auVar303._12_4_ = fVar336;
      fVar419 = local_538.lower - fVar352;
      fVar437 = (float)local_548._0_4_ - fVar353;
      fVar442 = local_538.upper - fVar356;
      fVar452 = (float)local_548._4_4_ - fVar357;
      fVar456 = local_538.upper - fVar352;
      fVar459 = (float)local_548._4_4_ - fVar353;
      fVar434 = fVar434 - fVar356;
      fVar328 = fVar328 - fVar357;
      fVar436 = fVar332 * fVar353 + fVar436;
      fVar298 = fVar389 * fVar353 + fVar298;
      auVar324._0_8_ = CONCAT44(fVar349,fVar389) ^ 0x8000000000000000;
      auVar324._8_4_ = -fVar349;
      auVar324._12_4_ = -fVar349;
      auVar214._0_4_ = fVar389 * fVar336 - fVar349 * fVar332;
      auVar214._4_4_ = auVar214._0_4_;
      auVar214._8_4_ = auVar214._0_4_;
      auVar214._12_4_ = auVar214._0_4_;
      auVar446 = divps(auVar324,auVar214);
      auVar301 = divps(auVar303,auVar214);
      fVar356 = auVar446._0_4_;
      fVar357 = auVar446._4_4_;
      fVar351 = auVar301._0_4_;
      fVar399 = auVar301._4_4_;
      fVar352 = fVar352 - (fVar298 * fVar351 + fVar436 * fVar356);
      fVar336 = fVar353 - (fVar298 * fVar399 + fVar436 * fVar357);
      fVar349 = fVar353 - (fVar298 * auVar301._8_4_ + fVar436 * auVar446._8_4_);
      fVar353 = fVar353 - (fVar298 * auVar301._12_4_ + fVar436 * auVar446._12_4_);
      auVar254._0_8_ = CONCAT44(fVar357 * fVar416,fVar357 * fVar435);
      auVar254._8_4_ = fVar357 * fVar497;
      auVar254._12_4_ = fVar357 * fVar418;
      auVar215._0_4_ = fVar357 * fVar358;
      auVar215._4_4_ = fVar357 * fVar432;
      auVar215._8_4_ = fVar357 * fVar368;
      auVar215._12_4_ = fVar357 * fVar423;
      auVar498._8_4_ = auVar254._8_4_;
      auVar498._0_8_ = auVar254._0_8_;
      auVar498._12_4_ = auVar254._12_4_;
      auVar287 = minps(auVar498,auVar215);
      auVar301 = maxps(auVar215,auVar254);
      auVar343._0_8_ = CONCAT44(fVar399 * fVar418,fVar399 * fVar497);
      auVar343._8_4_ = fVar399 * fVar500;
      auVar343._12_4_ = fVar399 * fVar417;
      auVar255._0_4_ = fVar399 * fVar368;
      auVar255._4_4_ = fVar399 * fVar423;
      auVar255._8_4_ = fVar399 * fVar413;
      auVar255._12_4_ = fVar399 * fVar326;
      auVar408._8_4_ = auVar343._8_4_;
      auVar408._0_8_ = auVar343._0_8_;
      auVar408._12_4_ = auVar343._12_4_;
      auVar246 = minps(auVar408,auVar255);
      auVar446 = maxps(auVar255,auVar343);
      fVar436 = 0.0 - (auVar446._0_4_ + auVar301._0_4_);
      fVar298 = 1.0 - (auVar446._4_4_ + auVar301._4_4_);
      fVar332 = 0.0 - (auVar446._8_4_ + auVar301._8_4_);
      fVar389 = 0.0 - (auVar446._12_4_ + auVar301._12_4_);
      fVar404 = 0.0 - (auVar246._0_4_ + auVar287._0_4_);
      fVar370 = 1.0 - (auVar246._4_4_ + auVar287._4_4_);
      fVar401 = 0.0 - (auVar246._8_4_ + auVar287._8_4_);
      fVar402 = 0.0 - (auVar246._12_4_ + auVar287._12_4_);
      auVar256._0_8_ = CONCAT44(fVar437 * fVar298,fVar419 * fVar436);
      auVar256._8_4_ = fVar442 * fVar332;
      auVar256._12_4_ = fVar452 * fVar389;
      auVar427._0_8_ = CONCAT44(fVar416 * fVar356,fVar435 * fVar356);
      auVar427._8_4_ = fVar497 * fVar356;
      auVar427._12_4_ = fVar418 * fVar356;
      auVar344._0_4_ = fVar356 * fVar358;
      auVar344._4_4_ = fVar356 * fVar432;
      auVar344._8_4_ = fVar356 * fVar368;
      auVar344._12_4_ = fVar356 * fVar423;
      auVar409._8_4_ = auVar427._8_4_;
      auVar409._0_8_ = auVar427._0_8_;
      auVar409._12_4_ = auVar427._12_4_;
      auVar446 = minps(auVar409,auVar344);
      auVar301 = maxps(auVar344,auVar427);
      auVar382._0_8_ = CONCAT44(fVar418 * fVar351,fVar497 * fVar351);
      auVar382._8_4_ = fVar500 * fVar351;
      auVar382._12_4_ = fVar417 * fVar351;
      auVar428._0_4_ = fVar351 * fVar368;
      auVar428._4_4_ = fVar351 * fVar423;
      auVar428._8_4_ = fVar351 * fVar413;
      auVar428._12_4_ = fVar351 * fVar326;
      auVar493._8_4_ = auVar382._8_4_;
      auVar493._0_8_ = auVar382._0_8_;
      auVar493._12_4_ = auVar382._12_4_;
      auVar287 = minps(auVar493,auVar428);
      auVar410._0_4_ = fVar419 * fVar404;
      auVar410._4_4_ = fVar437 * fVar370;
      auVar410._8_4_ = fVar442 * fVar401;
      auVar410._12_4_ = fVar452 * fVar402;
      auVar216._0_8_ = CONCAT44(fVar298 * fVar459,fVar436 * fVar456);
      auVar216._8_4_ = fVar332 * fVar434;
      auVar216._12_4_ = fVar389 * fVar328;
      auVar354._0_4_ = fVar404 * fVar456;
      auVar354._4_4_ = fVar370 * fVar459;
      auVar354._8_4_ = fVar401 * fVar434;
      auVar354._12_4_ = fVar402 * fVar328;
      auVar246 = maxps(auVar428,auVar382);
      fVar326 = 1.0 - (auVar246._0_4_ + auVar301._0_4_);
      fVar436 = 0.0 - (auVar246._4_4_ + auVar301._4_4_);
      fVar298 = 0.0 - (auVar246._8_4_ + auVar301._8_4_);
      fVar332 = 0.0 - (auVar246._12_4_ + auVar301._12_4_);
      fVar389 = 1.0 - (auVar287._0_4_ + auVar446._0_4_);
      fVar358 = 0.0 - (auVar287._4_4_ + auVar446._4_4_);
      fVar404 = 0.0 - (auVar287._8_4_ + auVar446._8_4_);
      fVar368 = 0.0 - (auVar287._12_4_ + auVar446._12_4_);
      auVar383._0_8_ = CONCAT44(fVar437 * fVar436,fVar419 * fVar326);
      auVar383._8_4_ = fVar442 * fVar298;
      auVar383._12_4_ = fVar452 * fVar332;
      auVar449._0_4_ = fVar419 * fVar389;
      auVar449._4_4_ = fVar437 * fVar358;
      auVar449._8_4_ = fVar442 * fVar404;
      auVar449._12_4_ = fVar452 * fVar368;
      auVar345._0_8_ = CONCAT44(fVar436 * fVar459,fVar326 * fVar456);
      auVar345._8_4_ = fVar298 * fVar434;
      auVar345._12_4_ = fVar332 * fVar328;
      auVar397._0_4_ = fVar389 * fVar456;
      auVar397._4_4_ = fVar358 * fVar459;
      auVar397._8_4_ = fVar404 * fVar434;
      auVar397._12_4_ = fVar368 * fVar328;
      auVar429._8_4_ = auVar383._8_4_;
      auVar429._0_8_ = auVar383._0_8_;
      auVar429._12_4_ = auVar383._12_4_;
      auVar301 = minps(auVar429,auVar449);
      auVar469._8_4_ = auVar345._8_4_;
      auVar469._0_8_ = auVar345._0_8_;
      auVar469._12_4_ = auVar345._12_4_;
      auVar446 = minps(auVar469,auVar397);
      auVar392 = minps(auVar301,auVar446);
      auVar446 = maxps(auVar449,auVar383);
      auVar301 = maxps(auVar397,auVar345);
      auVar246 = maxps(auVar301,auVar446);
      auVar384._8_4_ = auVar256._8_4_;
      auVar384._0_8_ = auVar256._0_8_;
      auVar384._12_4_ = auVar256._12_4_;
      auVar446 = minps(auVar384,auVar410);
      auVar346._8_4_ = auVar216._8_4_;
      auVar346._0_8_ = auVar216._0_8_;
      auVar346._12_4_ = auVar216._12_4_;
      auVar301 = minps(auVar346,auVar354);
      auVar446 = minps(auVar446,auVar301);
      auVar287 = maxps(auVar410,auVar256);
      auVar301 = maxps(auVar354,auVar216);
      auVar301 = maxps(auVar301,auVar287);
      auVar385._0_4_ = auVar392._4_4_ + auVar392._0_4_ + fVar352;
      auVar385._4_4_ = auVar446._4_4_ + auVar446._0_4_ + fVar336;
      auVar385._8_4_ = auVar392._8_4_ + auVar392._4_4_ + fVar349;
      auVar385._12_4_ = auVar392._12_4_ + auVar446._4_4_ + fVar353;
      fVar326 = auVar246._4_4_ + auVar246._0_4_ + fVar352;
      fVar328 = auVar301._4_4_ + auVar301._0_4_ + fVar336;
      auVar217._4_4_ = fVar328;
      auVar217._0_4_ = fVar326;
      auVar252 = maxps(_local_528,auVar385);
      auVar217._8_4_ = auVar246._8_4_ + auVar246._4_4_ + fVar349;
      auVar217._12_4_ = auVar246._12_4_ + auVar301._4_4_ + fVar353;
      auVar301 = minps(auVar217,auVar366);
      iVar296 = -(uint)(auVar301._0_4_ < auVar252._0_4_);
      iVar223 = -(uint)(auVar301._4_4_ < auVar252._4_4_);
      auVar218._4_4_ = iVar223;
      auVar218._0_4_ = iVar296;
      auVar218._8_4_ = iVar223;
      auVar218._12_4_ = iVar223;
      auVar220._8_8_ = auVar218._8_8_;
      auVar220._4_4_ = (float)iVar296;
      auVar220._0_4_ = (float)iVar296;
      iVar296 = movmskpd((uint)(fVar299 < 0.0),auVar220);
      auVar210 = _local_528;
      if (iVar296 == 0) {
        bVar144 = 0;
        if ((local_538.lower < auVar385._0_4_) && (fVar326 < local_538.upper)) {
          bVar144 = -(fVar328 < (float)local_548._4_4_) & (float)local_548._0_4_ < auVar385._4_4_;
        }
        bVar144 = bVar143 | bVar144;
        uVar147 = (ulong)CONCAT31(uVar46,bVar144);
        if (bVar144 != 1) goto LAB_003d5d94;
        uVar147 = 0xc9;
        do {
          uVar147 = uVar147 - 1;
          if (uVar147 == 0) goto LAB_003d63f6;
          fVar328 = 1.0 - fVar352;
          fVar299 = fVar352 * fVar352 * fVar352;
          fVar298 = fVar352 * fVar352 * 3.0 * fVar328;
          fVar326 = fVar328 * fVar328 * fVar328;
          fVar332 = fVar352 * 3.0 * fVar328 * fVar328;
          fVar328 = fVar326 * fVar412 + fVar332 * fVar388 + fVar298 * fVar386 + fVar299 * fVar450;
          fVar434 = fVar326 * fVar415 + fVar332 * fVar398 + fVar298 * fVar461 + fVar299 * fVar478;
          fVar436 = fVar326 * p00_1.field_0.v[2] +
                    fVar332 * fVar481 + fVar298 * p02.field_0.v[2] + fVar299 * fVar306;
          fVar298 = fVar326 * p00_1.field_0.v[3] +
                    fVar332 * fVar476 + fVar298 * p02.field_0.v[3] + fVar299 * fVar304;
          fVar299 = (fVar436 - fVar328) * fVar336;
          fVar332 = (fVar298 - fVar434) * fVar336;
          fVar326 = (fVar436 - fVar328) * fVar336 + fVar328;
          fVar436 = (fVar298 - fVar434) * fVar336 + fVar434;
          fVar352 = fVar352 - (fVar436 * fVar351 + fVar326 * fVar356);
          fVar336 = fVar336 - (fVar436 * fVar399 + fVar326 * fVar357);
          fVar298 = ABS(fVar436);
          auVar220._0_8_ = CONCAT44(fVar436,fVar326) & 0x7fffffff7fffffff;
          auVar220._8_4_ = ABS(fVar299 + fVar328);
          auVar220._12_4_ = ABS(fVar332 + fVar434);
          auVar252._0_8_ = CONCAT44(fVar436,fVar436) & 0x7fffffff7fffffff;
          auVar252._8_4_ = (int)fVar298;
          auVar252._12_4_ = (int)fVar298;
          if (fVar298 <= ABS(fVar326)) {
            auVar252._0_4_ = ABS(fVar326);
          }
        } while (fVar262 <= auVar252._0_4_);
        if ((((0.0 <= fVar352) && (fVar352 <= 1.0)) &&
            (auVar220._4_4_ = fVar336, auVar220._0_4_ = fVar336, auVar220._8_4_ = fVar336,
            auVar220._12_4_ = fVar336, 0.0 <= fVar336)) && (fVar336 <= 1.0)) {
          fVar326 = pre->ray_space[k].vx.field_0.m128[2];
          fVar328 = pre->ray_space[k].vy.field_0.m128[2];
          fVar434 = pre->ray_space[k].vz.field_0.m128[2];
          auVar257._0_4_ = fVar359 * fVar326;
          auVar257._4_4_ = fVar438 * fVar328;
          auVar257._8_4_ = fVar499 * fVar434;
          auVar257._12_4_ =
               (((fVar305 - fVar305 * (fVar484 * fVar485 - fVar485 * fVar484) * fVar420) * fVar403 +
                (fVar454 - fVar454 * (fVar334 * fVar458 - fVar458 * fVar334) * fVar421) * fVar230) -
               0.0) * 0.0;
          auVar258._8_8_ = auVar257._8_8_;
          auVar258._0_8_ = auVar258._8_8_;
          auVar252._4_12_ = auVar258._4_12_;
          fVar349 = 1.0 - fVar336;
          fVar389 = 1.0 - fVar352;
          fVar436 = fVar389 * fVar389 * fVar389;
          fVar298 = fVar352 * 3.0 * fVar389 * fVar389;
          fVar332 = fVar352 * fVar352 * fVar352;
          fVar299 = fVar352 * fVar352 * 3.0 * fVar389;
          auVar252._0_4_ =
               ((auVar257._8_4_ + auVar257._4_4_ + auVar257._0_4_) * fVar349 +
               (fVar327 * fVar434 + fVar440 * fVar328 + fVar473 * fVar326) * fVar336) * fVar436 +
               ((fVar483 * fVar434 + fVar453 * fVar328 + fVar369 * fVar326) * fVar349 +
               (fVar474 * fVar434 + fVar462 * fVar328 + fVar441 * fVar326) * fVar336) * fVar298 +
               ((fVar486 * fVar434 + fVar457 * fVar328 + fVar371 * fVar326) * fVar349 +
               (fVar479 * fVar434 + fVar464 * fVar328 + fVar451 * fVar326) * fVar336) * fVar299 +
               (fVar349 * (fVar329 * fVar434 + fVar471 * fVar328 + fVar387 * fVar326) +
               (fVar434 * fVar261 + fVar328 * fVar229 + fVar326 * fVar227) * fVar336) * fVar332;
          if ((fVar325 <= auVar252._0_4_) &&
             (fVar326 = *(float *)(ray + k * 4 + 0x80), auVar252._0_4_ <= fVar326)) {
            fVar351 = 1.0 - fVar336;
            fVar399 = 1.0 - fVar336;
            fVar353 = 1.0 - fVar336;
            fVar328 = fVar465 * fVar351 + fVar439 * fVar336;
            fVar434 = fVar475 * fVar399 + fVar414 * fVar336;
            fVar349 = fVar482 * fVar353 + fVar487 * fVar336;
            fVar356 = fVar333 * fVar351 + fVar335 * fVar336;
            fVar358 = fVar400 * fVar399 + fVar348 * fVar336;
            fVar368 = fVar463 * fVar353 + fVar350 * fVar336;
            fVar357 = fVar356 - fVar328;
            fVar404 = fVar358 - fVar434;
            fVar370 = fVar368 - fVar349;
            fVar328 = (((fVar328 - (fVar422 * fVar351 + fVar355 * fVar336)) * fVar389 +
                       fVar352 * fVar357) * fVar389 +
                      (fVar357 * fVar389 +
                      ((fVar351 * fVar460 + fVar488 * fVar336) - fVar356) * fVar352) * fVar352) *
                      3.0;
            fVar434 = (((fVar434 - (fVar431 * fVar399 + fVar411 * fVar336)) * fVar389 +
                       fVar352 * fVar404) * fVar389 +
                      (fVar404 * fVar389 +
                      ((fVar399 * fVar367 + fVar330 * fVar336) - fVar358) * fVar352) * fVar352) *
                      3.0;
            fVar389 = (((fVar349 - (fVar433 * fVar353 + fVar470 * fVar336)) * fVar389 +
                       fVar352 * fVar370) * fVar389 +
                      (fVar370 * fVar389 +
                      ((fVar353 * fVar430 + fVar331 * fVar336) - fVar368) * fVar352) * fVar352) *
                      3.0;
            pGVar31 = (context->scene->geometries).items[uVar155].ptr;
            if ((pGVar31->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar147 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar147 = CONCAT71((int7)((ulong)context->args >> 8),1),
                    pGVar31->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar336 = fVar436 * (fVar355 - fVar422) +
                        fVar298 * (fVar439 - fVar465) +
                        fVar299 * (fVar335 - fVar333) + fVar332 * (fVar488 - fVar460);
              fVar349 = fVar436 * (fVar411 - fVar431) +
                        fVar298 * (fVar414 - fVar475) +
                        fVar299 * (fVar348 - fVar400) + fVar332 * (fVar330 - fVar367);
              fVar436 = fVar436 * (fVar470 - fVar433) +
                        fVar298 * (fVar487 - fVar482) +
                        fVar299 * (fVar350 - fVar463) + fVar332 * (fVar331 - fVar430);
              local_c8 = fVar349 * fVar328 - fVar434 * fVar336;
              local_e8 = fVar436 * fVar434 - fVar389 * fVar349;
              local_d8 = fVar336 * fVar389 - fVar328 * fVar436;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              fStack_c4 = local_c8;
              fStack_c0 = local_c8;
              fStack_bc = local_c8;
              local_b8 = fVar352;
              fStack_b4 = fVar352;
              fStack_b0 = fVar352;
              fStack_ac = fVar352;
              local_a8 = auVar220;
              local_98 = CONCAT44(uVar156,uVar156);
              uStack_90 = CONCAT44(uVar156,uVar156);
              local_88 = CONCAT44(uVar155,uVar155);
              uStack_80 = CONCAT44(uVar155,uVar155);
              local_78 = context->user->instID[0];
              uStack_74 = local_78;
              uStack_70 = local_78;
              uStack_6c = local_78;
              local_68 = context->user->instPrimID[0];
              uStack_64 = local_68;
              uStack_60 = local_68;
              uStack_5c = local_68;
              *(float *)(ray + k * 4 + 0x80) = auVar252._0_4_;
              local_3a8 = *local_398;
              args.valid = (int *)local_3a8;
              args.geometryUserPtr = pGVar31->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = (RTCHitN *)&local_e8;
              args.N = 4;
              p_Var148 = pGVar31->occlusionFilterN;
              if (p_Var148 != (RTCFilterFunctionN)0x0) {
                p_Var148 = (RTCFilterFunctionN)(*p_Var148)(&args);
              }
              auVar259._0_4_ = -(uint)(local_3a8._0_4_ == 0);
              auVar259._4_4_ = -(uint)(local_3a8._4_4_ == 0);
              auVar259._8_4_ = -(uint)(local_3a8._8_4_ == 0);
              auVar259._12_4_ = -(uint)(local_3a8._12_4_ == 0);
              uVar145 = movmskps((int)p_Var148,auVar259);
              pRVar149 = (RTCRayN *)(ulong)(uVar145 ^ 0xf);
              if ((uVar145 ^ 0xf) == 0) {
                auVar259 = auVar259 ^ _DAT_01f46b70;
                auVar220 = local_3a8;
              }
              else {
                p_Var148 = context->args->filter;
                if ((p_Var148 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar31->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var148)(&args);
                }
                auVar219._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                auVar219._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                auVar219._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                auVar219._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                auVar259 = auVar219 ^ _DAT_01f46b70;
                auVar220 = ~auVar219 & _DAT_01f45a40 |
                           *(undefined1 (*) [16])(args.ray + 0x80) & auVar219;
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar220;
                pRVar149 = args.ray;
              }
              auVar252._0_4_ = (float)(auVar259._0_4_ << 0x1f);
              auVar252._4_4_ = auVar259._4_4_ << 0x1f;
              auVar252._8_4_ = auVar259._8_4_ << 0x1f;
              auVar252._12_4_ = auVar259._12_4_ << 0x1f;
              iVar296 = movmskps((int)pRVar149,auVar252);
              uVar147 = (ulong)CONCAT31((int3)((uint)iVar296 >> 8),iVar296 != 0);
              if (iVar296 == 0) {
                *(float *)(ray + k * 4 + 0x80) = fVar326;
              }
            }
            bVar150 = bVar150 | (byte)uVar147;
          }
        }
      }
    }
  }
  goto LAB_003d63f6;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }